

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersector1<8>::
     intersect_t<embree::avx512::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  int iVar13;
  RTCFilterFunctionN p_Var14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined8 uVar21;
  ulong uVar22;
  undefined8 uVar23;
  uint uVar24;
  long lVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  byte bVar73;
  ulong uVar74;
  uint uVar75;
  uint uVar76;
  long lVar77;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  Geometry *pGVar78;
  uint uVar79;
  ulong uVar80;
  ulong uVar81;
  byte bVar82;
  float fVar83;
  float fVar84;
  float fVar137;
  float fVar141;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar138;
  float fVar144;
  float fVar145;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar91 [16];
  float fVar139;
  float fVar140;
  float fVar142;
  float fVar143;
  float fVar146;
  float fVar147;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar148;
  undefined4 uVar149;
  float fVar159;
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  float fVar169;
  float fVar170;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [64];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [64];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [64];
  undefined1 auVar200 [16];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [64];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  int local_554;
  ulong local_550;
  RayHit *local_548;
  RayQueryContext *local_540;
  ulong local_538;
  float local_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined8 local_520;
  undefined8 uStack_518;
  Precalculations *local_510;
  Primitive *local_508;
  RTCFilterFunctionNArguments local_500;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined8 local_4b0;
  undefined4 local_4a8;
  float local_4a4;
  undefined4 local_4a0;
  undefined4 local_49c;
  undefined4 local_498;
  uint local_494;
  uint local_490;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  int local_25c;
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar12 = prim[1];
  uVar81 = (ulong)(byte)PVar12;
  fVar170 = *(float *)(prim + uVar81 * 0x19 + 0x12);
  auVar90 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar81 * 0x19 + 6));
  fVar169 = fVar170 * auVar90._0_4_;
  fVar148 = fVar170 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar81 * 4 + 6);
  auVar97 = vpmovsxbd_avx2(auVar89);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar81 * 5 + 6);
  auVar95 = vpmovsxbd_avx2(auVar88);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar81 * 6 + 6);
  auVar111 = vpmovsxbd_avx2(auVar87);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar81 * 0xb + 6);
  auVar109 = vpmovsxbd_avx2(auVar8);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar12 * 0xc) + 6);
  auVar99 = vpmovsxbd_avx2(auVar85);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar107 = vcvtdq2ps_avx(auVar99);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (uint)(byte)PVar12 * 0xc + uVar81 + 6);
  auVar96 = vpmovsxbd_avx2(auVar9);
  auVar96 = vcvtdq2ps_avx(auVar96);
  uVar80 = (ulong)(uint)((int)(uVar81 * 9) * 2);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar80 + 6);
  auVar98 = vpmovsxbd_avx2(auVar10);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar80 + uVar81 + 6);
  auVar108 = vpmovsxbd_avx2(auVar11);
  auVar108 = vcvtdq2ps_avx(auVar108);
  uVar74 = (ulong)(uint)((int)(uVar81 * 5) << 2);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar74 + 6);
  auVar94 = vpmovsxbd_avx2(auVar86);
  auVar110 = vcvtdq2ps_avx(auVar94);
  auVar206._4_4_ = fVar148;
  auVar206._0_4_ = fVar148;
  auVar206._8_4_ = fVar148;
  auVar206._12_4_ = fVar148;
  auVar206._16_4_ = fVar148;
  auVar206._20_4_ = fVar148;
  auVar206._24_4_ = fVar148;
  auVar206._28_4_ = fVar148;
  auVar209._8_4_ = 1;
  auVar209._0_8_ = 0x100000001;
  auVar209._12_4_ = 1;
  auVar209._16_4_ = 1;
  auVar209._20_4_ = 1;
  auVar209._24_4_ = 1;
  auVar209._28_4_ = 1;
  auVar92 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar101 = ZEXT1632(CONCAT412(fVar170 * (ray->super_RayK<1>).dir.field_0.m128[3],
                                CONCAT48(fVar170 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                         CONCAT44(fVar170 * (ray->super_RayK<1>).dir.field_0.m128[1]
                                                  ,fVar148))));
  auVar100 = vpermps_avx2(auVar209,auVar101);
  auVar93 = vpermps_avx512vl(auVar92,auVar101);
  fVar148 = auVar93._0_4_;
  fVar159 = auVar93._4_4_;
  auVar101._4_4_ = fVar159 * auVar111._4_4_;
  auVar101._0_4_ = fVar148 * auVar111._0_4_;
  fVar83 = auVar93._8_4_;
  auVar101._8_4_ = fVar83 * auVar111._8_4_;
  fVar84 = auVar93._12_4_;
  auVar101._12_4_ = fVar84 * auVar111._12_4_;
  fVar137 = auVar93._16_4_;
  auVar101._16_4_ = fVar137 * auVar111._16_4_;
  fVar138 = auVar93._20_4_;
  auVar101._20_4_ = fVar138 * auVar111._20_4_;
  fVar141 = auVar93._24_4_;
  auVar101._24_4_ = fVar141 * auVar111._24_4_;
  auVar101._28_4_ = auVar99._28_4_;
  auVar99._4_4_ = auVar96._4_4_ * fVar159;
  auVar99._0_4_ = auVar96._0_4_ * fVar148;
  auVar99._8_4_ = auVar96._8_4_ * fVar83;
  auVar99._12_4_ = auVar96._12_4_ * fVar84;
  auVar99._16_4_ = auVar96._16_4_ * fVar137;
  auVar99._20_4_ = auVar96._20_4_ * fVar138;
  auVar99._24_4_ = auVar96._24_4_ * fVar141;
  auVar99._28_4_ = auVar94._28_4_;
  auVar94._4_4_ = auVar110._4_4_ * fVar159;
  auVar94._0_4_ = auVar110._0_4_ * fVar148;
  auVar94._8_4_ = auVar110._8_4_ * fVar83;
  auVar94._12_4_ = auVar110._12_4_ * fVar84;
  auVar94._16_4_ = auVar110._16_4_ * fVar137;
  auVar94._20_4_ = auVar110._20_4_ * fVar138;
  auVar94._24_4_ = auVar110._24_4_ * fVar141;
  auVar94._28_4_ = auVar93._28_4_;
  auVar89 = vfmadd231ps_fma(auVar101,auVar100,auVar95);
  auVar88 = vfmadd231ps_fma(auVar99,auVar100,auVar107);
  auVar87 = vfmadd231ps_fma(auVar94,auVar108,auVar100);
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar206,auVar97);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar206,auVar109);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar98,auVar206);
  auVar207._4_4_ = fVar169;
  auVar207._0_4_ = fVar169;
  auVar207._8_4_ = fVar169;
  auVar207._12_4_ = fVar169;
  auVar207._16_4_ = fVar169;
  auVar207._20_4_ = fVar169;
  auVar207._24_4_ = fVar169;
  auVar207._28_4_ = fVar169;
  auVar94 = ZEXT1632(CONCAT412(fVar170 * auVar90._12_4_,
                               CONCAT48(fVar170 * auVar90._8_4_,
                                        CONCAT44(fVar170 * auVar90._4_4_,fVar169))));
  auVar99 = vpermps_avx2(auVar209,auVar94);
  auVar94 = vpermps_avx512vl(auVar92,auVar94);
  fVar170 = auVar94._0_4_;
  fVar148 = auVar94._4_4_;
  auVar100._4_4_ = fVar148 * auVar111._4_4_;
  auVar100._0_4_ = fVar170 * auVar111._0_4_;
  fVar159 = auVar94._8_4_;
  auVar100._8_4_ = fVar159 * auVar111._8_4_;
  fVar83 = auVar94._12_4_;
  auVar100._12_4_ = fVar83 * auVar111._12_4_;
  fVar84 = auVar94._16_4_;
  auVar100._16_4_ = fVar84 * auVar111._16_4_;
  fVar137 = auVar94._20_4_;
  auVar100._20_4_ = fVar137 * auVar111._20_4_;
  fVar138 = auVar94._24_4_;
  auVar100._24_4_ = fVar138 * auVar111._24_4_;
  auVar100._28_4_ = 1;
  auVar92._4_4_ = auVar96._4_4_ * fVar148;
  auVar92._0_4_ = auVar96._0_4_ * fVar170;
  auVar92._8_4_ = auVar96._8_4_ * fVar159;
  auVar92._12_4_ = auVar96._12_4_ * fVar83;
  auVar92._16_4_ = auVar96._16_4_ * fVar84;
  auVar92._20_4_ = auVar96._20_4_ * fVar137;
  auVar92._24_4_ = auVar96._24_4_ * fVar138;
  auVar92._28_4_ = auVar111._28_4_;
  auVar96._4_4_ = auVar110._4_4_ * fVar148;
  auVar96._0_4_ = auVar110._0_4_ * fVar170;
  auVar96._8_4_ = auVar110._8_4_ * fVar159;
  auVar96._12_4_ = auVar110._12_4_ * fVar83;
  auVar96._16_4_ = auVar110._16_4_ * fVar84;
  auVar96._20_4_ = auVar110._20_4_ * fVar137;
  auVar96._24_4_ = auVar110._24_4_ * fVar138;
  auVar96._28_4_ = auVar94._28_4_;
  auVar8 = vfmadd231ps_fma(auVar100,auVar99,auVar95);
  auVar85 = vfmadd231ps_fma(auVar92,auVar99,auVar107);
  auVar9 = vfmadd231ps_fma(auVar96,auVar99,auVar108);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar207,auVar97);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar207,auVar109);
  auVar193._8_4_ = 0x7fffffff;
  auVar193._0_8_ = 0x7fffffff7fffffff;
  auVar193._12_4_ = 0x7fffffff;
  auVar193._16_4_ = 0x7fffffff;
  auVar193._20_4_ = 0x7fffffff;
  auVar193._24_4_ = 0x7fffffff;
  auVar193._28_4_ = 0x7fffffff;
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar207,auVar98);
  auVar97 = vandps_avx(ZEXT1632(auVar89),auVar193);
  auVar106._8_4_ = 0x219392ef;
  auVar106._0_8_ = 0x219392ef219392ef;
  auVar106._12_4_ = 0x219392ef;
  auVar106._16_4_ = 0x219392ef;
  auVar106._20_4_ = 0x219392ef;
  auVar106._24_4_ = 0x219392ef;
  auVar106._28_4_ = 0x219392ef;
  uVar80 = vcmpps_avx512vl(auVar97,auVar106,1);
  bVar15 = (bool)((byte)uVar80 & 1);
  auVar93._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar89._0_4_;
  bVar15 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar89._4_4_;
  bVar15 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar89._8_4_;
  bVar15 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar89._12_4_;
  auVar93._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * 0x219392ef;
  auVar93._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * 0x219392ef;
  auVar93._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * 0x219392ef;
  auVar93._28_4_ = (uint)(byte)(uVar80 >> 7) * 0x219392ef;
  auVar97 = vandps_avx(ZEXT1632(auVar88),auVar193);
  uVar80 = vcmpps_avx512vl(auVar97,auVar106,1);
  bVar15 = (bool)((byte)uVar80 & 1);
  auVar102._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar88._0_4_;
  bVar15 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar102._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar88._4_4_;
  bVar15 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar102._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar88._8_4_;
  bVar15 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar102._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar88._12_4_;
  auVar102._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * 0x219392ef;
  auVar102._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * 0x219392ef;
  auVar102._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * 0x219392ef;
  auVar102._28_4_ = (uint)(byte)(uVar80 >> 7) * 0x219392ef;
  auVar97 = vandps_avx(ZEXT1632(auVar87),auVar193);
  uVar80 = vcmpps_avx512vl(auVar97,auVar106,1);
  bVar15 = (bool)((byte)uVar80 & 1);
  auVar97._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar87._0_4_;
  bVar15 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar97._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar87._4_4_;
  bVar15 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar97._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar87._8_4_;
  bVar15 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar97._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar87._12_4_;
  auVar97._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * 0x219392ef;
  auVar97._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * 0x219392ef;
  auVar97._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * 0x219392ef;
  auVar97._28_4_ = (uint)(byte)(uVar80 >> 7) * 0x219392ef;
  auVar95 = vrcp14ps_avx512vl(auVar93);
  auVar192._8_4_ = 0x3f800000;
  auVar192._0_8_ = 0x3f8000003f800000;
  auVar192._12_4_ = 0x3f800000;
  auVar192._16_4_ = 0x3f800000;
  auVar192._20_4_ = 0x3f800000;
  auVar192._24_4_ = 0x3f800000;
  auVar192._28_4_ = 0x3f800000;
  auVar89 = vfnmadd213ps_fma(auVar93,auVar95,auVar192);
  auVar89 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar95,auVar95);
  auVar95 = vrcp14ps_avx512vl(auVar102);
  auVar88 = vfnmadd213ps_fma(auVar102,auVar95,auVar192);
  auVar88 = vfmadd132ps_fma(ZEXT1632(auVar88),auVar95,auVar95);
  auVar95 = vrcp14ps_avx512vl(auVar97);
  auVar87 = vfnmadd213ps_fma(auVar97,auVar95,auVar192);
  auVar87 = vfmadd132ps_fma(ZEXT1632(auVar87),auVar95,auVar95);
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 * 7 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar8));
  auVar98._4_4_ = auVar89._4_4_ * auVar97._4_4_;
  auVar98._0_4_ = auVar89._0_4_ * auVar97._0_4_;
  auVar98._8_4_ = auVar89._8_4_ * auVar97._8_4_;
  auVar98._12_4_ = auVar89._12_4_ * auVar97._12_4_;
  auVar98._16_4_ = auVar97._16_4_ * 0.0;
  auVar98._20_4_ = auVar97._20_4_ * 0.0;
  auVar98._24_4_ = auVar97._24_4_ * 0.0;
  auVar98._28_4_ = auVar97._28_4_;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 * 9 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar8));
  auVar96 = vpbroadcastd_avx512vl();
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar12 * 0x10 + 6));
  auVar105._0_4_ = auVar89._0_4_ * auVar97._0_4_;
  auVar105._4_4_ = auVar89._4_4_ * auVar97._4_4_;
  auVar105._8_4_ = auVar89._8_4_ * auVar97._8_4_;
  auVar105._12_4_ = auVar89._12_4_ * auVar97._12_4_;
  auVar105._16_4_ = auVar97._16_4_ * 0.0;
  auVar105._20_4_ = auVar97._20_4_ * 0.0;
  auVar105._24_4_ = auVar97._24_4_ * 0.0;
  auVar105._28_4_ = 0;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar12 * 0x10 + uVar81 * -2 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar85));
  auVar108._4_4_ = auVar88._4_4_ * auVar97._4_4_;
  auVar108._0_4_ = auVar88._0_4_ * auVar97._0_4_;
  auVar108._8_4_ = auVar88._8_4_ * auVar97._8_4_;
  auVar108._12_4_ = auVar88._12_4_ * auVar97._12_4_;
  auVar108._16_4_ = auVar97._16_4_ * 0.0;
  auVar108._20_4_ = auVar97._20_4_ * 0.0;
  auVar108._24_4_ = auVar97._24_4_ * 0.0;
  auVar108._28_4_ = auVar97._28_4_;
  auVar97 = vcvtdq2ps_avx(auVar95);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar85));
  auVar104._0_4_ = auVar88._0_4_ * auVar97._0_4_;
  auVar104._4_4_ = auVar88._4_4_ * auVar97._4_4_;
  auVar104._8_4_ = auVar88._8_4_ * auVar97._8_4_;
  auVar104._12_4_ = auVar88._12_4_ * auVar97._12_4_;
  auVar104._16_4_ = auVar97._16_4_ * 0.0;
  auVar104._20_4_ = auVar97._20_4_ * 0.0;
  auVar104._24_4_ = auVar97._24_4_ * 0.0;
  auVar104._28_4_ = 0;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 + uVar81 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar9));
  auVar110._4_4_ = auVar97._4_4_ * auVar87._4_4_;
  auVar110._0_4_ = auVar97._0_4_ * auVar87._0_4_;
  auVar110._8_4_ = auVar97._8_4_ * auVar87._8_4_;
  auVar110._12_4_ = auVar97._12_4_ * auVar87._12_4_;
  auVar110._16_4_ = auVar97._16_4_ * 0.0;
  auVar110._20_4_ = auVar97._20_4_ * 0.0;
  auVar110._24_4_ = auVar97._24_4_ * 0.0;
  auVar110._28_4_ = auVar97._28_4_;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 * 0x17 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar9));
  auVar103._0_4_ = auVar87._0_4_ * auVar97._0_4_;
  auVar103._4_4_ = auVar87._4_4_ * auVar97._4_4_;
  auVar103._8_4_ = auVar87._8_4_ * auVar97._8_4_;
  auVar103._12_4_ = auVar87._12_4_ * auVar97._12_4_;
  auVar103._16_4_ = auVar97._16_4_ * 0.0;
  auVar103._20_4_ = auVar97._20_4_ * 0.0;
  auVar103._24_4_ = auVar97._24_4_ * 0.0;
  auVar103._28_4_ = 0;
  auVar97 = vpminsd_avx2(auVar98,auVar105);
  auVar95 = vpminsd_avx2(auVar108,auVar104);
  auVar97 = vmaxps_avx(auVar97,auVar95);
  auVar95 = vpminsd_avx2(auVar110,auVar103);
  uVar149 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar111._4_4_ = uVar149;
  auVar111._0_4_ = uVar149;
  auVar111._8_4_ = uVar149;
  auVar111._12_4_ = uVar149;
  auVar111._16_4_ = uVar149;
  auVar111._20_4_ = uVar149;
  auVar111._24_4_ = uVar149;
  auVar111._28_4_ = uVar149;
  auVar95 = vmaxps_avx512vl(auVar95,auVar111);
  auVar97 = vmaxps_avx(auVar97,auVar95);
  auVar95._8_4_ = 0x3f7ffffa;
  auVar95._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar95._12_4_ = 0x3f7ffffa;
  auVar95._16_4_ = 0x3f7ffffa;
  auVar95._20_4_ = 0x3f7ffffa;
  auVar95._24_4_ = 0x3f7ffffa;
  auVar95._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar97,auVar95);
  auVar97 = vpmaxsd_avx2(auVar98,auVar105);
  auVar95 = vpmaxsd_avx2(auVar108,auVar104);
  auVar97 = vminps_avx(auVar97,auVar95);
  auVar95 = vpmaxsd_avx2(auVar110,auVar103);
  fVar170 = (ray->super_RayK<1>).tfar;
  auVar109._4_4_ = fVar170;
  auVar109._0_4_ = fVar170;
  auVar109._8_4_ = fVar170;
  auVar109._12_4_ = fVar170;
  auVar109._16_4_ = fVar170;
  auVar109._20_4_ = fVar170;
  auVar109._24_4_ = fVar170;
  auVar109._28_4_ = fVar170;
  auVar95 = vminps_avx512vl(auVar95,auVar109);
  auVar97 = vminps_avx(auVar97,auVar95);
  auVar107._8_4_ = 0x3f800003;
  auVar107._0_8_ = 0x3f8000033f800003;
  auVar107._12_4_ = 0x3f800003;
  auVar107._16_4_ = 0x3f800003;
  auVar107._20_4_ = 0x3f800003;
  auVar107._24_4_ = 0x3f800003;
  auVar107._28_4_ = 0x3f800003;
  auVar97 = vmulps_avx512vl(auVar97,auVar107);
  uVar23 = vpcmpgtd_avx512vl(auVar96,_DAT_01fe9900);
  uVar21 = vcmpps_avx512vl(local_80,auVar97,2);
  if ((byte)((byte)uVar21 & (byte)uVar23) != 0) {
    uVar80 = (ulong)(byte)((byte)uVar21 & (byte)uVar23);
    local_540 = context;
    local_548 = ray;
    local_508 = prim;
    local_510 = pre;
    do {
      auVar97 = local_440;
      lVar25 = 0;
      for (uVar74 = uVar80; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      uVar79 = *(uint *)(prim + 2);
      uVar76 = *(uint *)(prim + lVar25 * 4 + 6);
      local_550 = (ulong)uVar79;
      pGVar78 = (context->scene->geometries).items[uVar79].ptr;
      local_538 = (ulong)uVar76;
      uVar74 = (ulong)*(uint *)(*(long *)&pGVar78->field_0x58 +
                               pGVar78[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar76);
      p_Var14 = pGVar78[1].intersectionFilterN;
      lVar25 = *(long *)&pGVar78[1].time_range.upper;
      local_4c0 = *(undefined1 (*) [16])(lVar25 + (long)p_Var14 * uVar74);
      local_4d0 = *(undefined1 (*) [16])(lVar25 + (uVar74 + 1) * (long)p_Var14);
      pauVar3 = (undefined1 (*) [16])(lVar25 + (uVar74 + 2) * (long)p_Var14);
      auVar89 = *pauVar3;
      local_520 = *(undefined8 *)*pauVar3;
      uStack_518 = *(undefined8 *)(*pauVar3 + 8);
      uVar80 = uVar80 - 1 & uVar80;
      pauVar4 = (undefined1 (*) [12])(lVar25 + (uVar74 + 3) * (long)p_Var14);
      local_220 = *(undefined8 *)*pauVar4;
      uStack_218 = *(undefined8 *)(*pauVar4 + 8);
      local_530 = (float)local_220;
      fStack_52c = (float)((ulong)local_220 >> 0x20);
      fStack_528 = (float)uStack_218;
      fStack_524 = (float)((ulong)uStack_218 >> 0x20);
      if (uVar80 != 0) {
        uVar81 = uVar80 - 1 & uVar80;
        for (uVar74 = uVar80; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
        }
        if (uVar81 != 0) {
          for (; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar13 = (int)pGVar78[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar5 = (ray->super_RayK<1>).org.field_0;
      auVar87 = vsubps_avx(local_4c0,(undefined1  [16])aVar5);
      uVar149 = auVar87._0_4_;
      auVar160._4_4_ = uVar149;
      auVar160._0_4_ = uVar149;
      auVar160._8_4_ = uVar149;
      auVar160._12_4_ = uVar149;
      auVar88 = vshufps_avx(auVar87,auVar87,0x55);
      auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
      aVar6 = (pre->ray_space).vx.field_0;
      aVar7 = (pre->ray_space).vy.field_0;
      fVar170 = (pre->ray_space).vz.field_0.m128[0];
      fVar148 = (pre->ray_space).vz.field_0.m128[1];
      fVar159 = (pre->ray_space).vz.field_0.m128[2];
      fVar83 = (pre->ray_space).vz.field_0.m128[3];
      auVar195._0_4_ = auVar87._0_4_ * fVar170;
      auVar195._4_4_ = auVar87._4_4_ * fVar148;
      auVar195._8_4_ = auVar87._8_4_ * fVar159;
      auVar195._12_4_ = auVar87._12_4_ * fVar83;
      auVar88 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar7,auVar88);
      auVar9 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar6,auVar160);
      auVar88 = vshufps_avx(local_4c0,local_4c0,0xff);
      auVar8 = vsubps_avx(local_4d0,(undefined1  [16])aVar5);
      uVar149 = auVar8._0_4_;
      auVar162._4_4_ = uVar149;
      auVar162._0_4_ = uVar149;
      auVar162._8_4_ = uVar149;
      auVar162._12_4_ = uVar149;
      auVar87 = vshufps_avx(auVar8,auVar8,0x55);
      auVar8 = vshufps_avx(auVar8,auVar8,0xaa);
      auVar196._0_4_ = auVar8._0_4_ * fVar170;
      auVar196._4_4_ = auVar8._4_4_ * fVar148;
      auVar196._8_4_ = auVar8._8_4_ * fVar159;
      auVar196._12_4_ = auVar8._12_4_ * fVar83;
      auVar87 = vfmadd231ps_fma(auVar196,(undefined1  [16])aVar7,auVar87);
      auVar10 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar6,auVar162);
      auVar87 = vshufps_avx(local_4d0,local_4d0,0xff);
      auVar85 = vsubps_avx512vl(auVar89,(undefined1  [16])aVar5);
      uVar149 = auVar85._0_4_;
      auVar191._4_4_ = uVar149;
      auVar191._0_4_ = uVar149;
      auVar191._8_4_ = uVar149;
      auVar191._12_4_ = uVar149;
      auVar8 = vshufps_avx(auVar85,auVar85,0x55);
      auVar85 = vshufps_avx(auVar85,auVar85,0xaa);
      auVar200._0_4_ = auVar85._0_4_ * fVar170;
      auVar200._4_4_ = auVar85._4_4_ * fVar148;
      auVar200._8_4_ = auVar85._8_4_ * fVar159;
      auVar200._12_4_ = auVar85._12_4_ * fVar83;
      auVar8 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar7,auVar8);
      auVar11 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar6,auVar191);
      auVar86 = vshufps_avx512vl(auVar89,auVar89,0xff);
      auVar90._12_4_ = fStack_524;
      auVar90._0_12_ = *pauVar4;
      local_3e0 = ZEXT1632((undefined1  [16])aVar5);
      auVar85 = vsubps_avx512vl(auVar90,(undefined1  [16])aVar5);
      uVar149 = auVar85._0_4_;
      auVar91._4_4_ = uVar149;
      auVar91._0_4_ = uVar149;
      auVar91._8_4_ = uVar149;
      auVar91._12_4_ = uVar149;
      auVar8 = vshufps_avx(auVar85,auVar85,0x55);
      auVar85 = vshufps_avx(auVar85,auVar85,0xaa);
      auVar203._0_4_ = auVar85._0_4_ * fVar170;
      auVar203._4_4_ = auVar85._4_4_ * fVar148;
      auVar203._8_4_ = auVar85._8_4_ * fVar159;
      auVar203._12_4_ = auVar85._12_4_ * fVar83;
      auVar8 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar7,auVar8);
      auVar8 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar6,auVar91);
      lVar25 = (long)iVar13 * 0x44;
      auVar95 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25);
      uVar149 = auVar9._0_4_;
      local_2e0._4_4_ = uVar149;
      local_2e0._0_4_ = uVar149;
      local_2e0._8_4_ = uVar149;
      local_2e0._12_4_ = uVar149;
      local_2e0._16_4_ = uVar149;
      local_2e0._20_4_ = uVar149;
      local_2e0._24_4_ = uVar149;
      local_2e0._28_4_ = uVar149;
      auVar150._8_4_ = 1;
      auVar150._0_8_ = 0x100000001;
      auVar150._12_4_ = 1;
      auVar150._16_4_ = 1;
      auVar150._20_4_ = 1;
      auVar150._24_4_ = 1;
      auVar150._28_4_ = 1;
      local_300 = vpermps_avx512vl(auVar150,ZEXT1632(auVar9));
      auVar111 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x484);
      local_320 = vbroadcastss_avx512vl(auVar10);
      local_340 = vpermps_avx512vl(auVar150,ZEXT1632(auVar10));
      auVar109 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x908);
      local_360 = vbroadcastss_avx512vl(auVar11);
      local_380 = vpermps_avx512vl(auVar150,ZEXT1632(auVar11));
      auVar107 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0xd8c);
      fVar148 = auVar8._0_4_;
      local_3a0._4_4_ = fVar148;
      local_3a0._0_4_ = fVar148;
      fStack_398 = fVar148;
      fStack_394 = fVar148;
      fStack_390 = fVar148;
      fStack_38c = fVar148;
      fStack_388 = fVar148;
      register0x0000139c = fVar148;
      _local_3c0 = vpermps_avx512vl(auVar150,ZEXT1632(auVar8));
      auVar96 = vmulps_avx512vl(_local_3a0,auVar107);
      auVar98 = vmulps_avx512vl(_local_3c0,auVar107);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar109,local_360);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar109,local_380);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar111,local_320);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar111,local_340);
      auVar99 = vfmadd231ps_avx512vl(auVar96,auVar95,local_2e0);
      auVar190 = ZEXT3264(auVar99);
      auVar94 = vfmadd231ps_avx512vl(auVar98,auVar95,local_300);
      auVar185 = ZEXT3264(auVar94);
      auVar96 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25);
      auVar98 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x484);
      auVar108 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x908);
      auVar110 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0xd8c);
      auVar100 = vmulps_avx512vl(_local_3a0,auVar110);
      auVar101 = vmulps_avx512vl(_local_3c0,auVar110);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar108,local_360);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar108,local_380);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar98,local_320);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar98,local_340);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar96,local_2e0);
      auVar194 = ZEXT3264(auVar100);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar96,local_300);
      auVar92 = vsubps_avx512vl(auVar100,auVar99);
      auVar93 = vsubps_avx512vl(auVar101,auVar94);
      auVar102 = vmulps_avx512vl(auVar94,auVar92);
      auVar103 = vmulps_avx512vl(auVar99,auVar93);
      auVar102 = vsubps_avx512vl(auVar102,auVar103);
      auVar85 = vshufps_avx512vl(auVar90,auVar90,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar88);
      local_c0 = vbroadcastsd_avx512vl(auVar87);
      local_e0 = vbroadcastsd_avx512vl(auVar86);
      local_100 = vbroadcastsd_avx512vl(auVar85);
      auVar103 = vmulps_avx512vl(local_100,auVar107);
      auVar88 = vfmadd231ps_fma(auVar103,auVar109,local_e0);
      auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar111,local_c0);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar95,local_a0);
      auVar104 = vmulps_avx512vl(local_100,auVar110);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar108,local_e0);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar98,local_c0);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar96,local_a0);
      auVar105 = vmulps_avx512vl(auVar93,auVar93);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar92,auVar92);
      auVar106 = vmaxps_avx512vl(auVar103,auVar104);
      auVar106 = vmulps_avx512vl(auVar106,auVar106);
      auVar105 = vmulps_avx512vl(auVar106,auVar105);
      auVar102 = vmulps_avx512vl(auVar102,auVar102);
      uVar21 = vcmpps_avx512vl(auVar102,auVar105,2);
      auVar88 = vblendps_avx(auVar9,local_4c0,8);
      auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar85 = vandps_avx512vl(auVar88,auVar87);
      auVar88 = vblendps_avx(auVar10,local_4d0,8);
      auVar88 = vandps_avx512vl(auVar88,auVar87);
      auVar88 = vmaxps_avx(auVar85,auVar88);
      auVar89 = vblendps_avx(auVar11,auVar89,8);
      auVar85 = vandps_avx512vl(auVar89,auVar87);
      auVar89 = vblendps_avx(auVar8,auVar90,8);
      auVar89 = vandps_avx512vl(auVar89,auVar87);
      auVar89 = vmaxps_avx(auVar85,auVar89);
      auVar89 = vmaxps_avx(auVar88,auVar89);
      auVar88 = vmovshdup_avx(auVar89);
      auVar88 = vmaxss_avx(auVar88,auVar89);
      auVar89 = vshufpd_avx(auVar89,auVar89,1);
      auVar89 = vmaxss_avx(auVar89,auVar88);
      auVar205._0_4_ = (float)iVar13;
      local_440._4_12_ = auVar9._4_12_;
      local_440._0_4_ = auVar205._0_4_;
      local_440._16_16_ = auVar97._16_16_;
      auVar205._4_4_ = auVar205._0_4_;
      auVar205._8_4_ = auVar205._0_4_;
      auVar205._12_4_ = auVar205._0_4_;
      auVar205._16_4_ = auVar205._0_4_;
      auVar205._20_4_ = auVar205._0_4_;
      auVar205._24_4_ = auVar205._0_4_;
      auVar205._28_4_ = auVar205._0_4_;
      uVar23 = vcmpps_avx512vl(auVar205,_DAT_01faff40,0xe);
      bVar82 = (byte)uVar21 & (byte)uVar23;
      fVar170 = auVar89._0_4_ * 4.7683716e-07;
      local_420._0_16_ = ZEXT416((uint)fVar170);
      auVar151._8_4_ = 2;
      auVar151._0_8_ = 0x200000002;
      auVar151._12_4_ = 2;
      auVar151._16_4_ = 2;
      auVar151._20_4_ = 2;
      auVar151._24_4_ = 2;
      auVar151._28_4_ = 2;
      local_480 = vpermps_avx512vl(auVar151,ZEXT1632(auVar9));
      auVar212 = ZEXT3264(local_480);
      local_160 = vpermps_avx2(auVar151,ZEXT1632(auVar10));
      local_180 = vpermps_avx2(auVar151,ZEXT1632(auVar11));
      local_1a0 = vpermps_avx2(auVar151,ZEXT1632(auVar8));
      if (bVar82 != 0) {
        auVar97 = vmulps_avx512vl(local_1a0,auVar110);
        auVar97 = vfmadd213ps_avx512vl(auVar108,local_180,auVar97);
        auVar97 = vfmadd213ps_avx512vl(auVar98,local_160,auVar97);
        auVar96 = vfmadd213ps_avx512vl(auVar96,local_480,auVar97);
        auVar97 = vmulps_avx512vl(local_1a0,auVar107);
        auVar97 = vfmadd213ps_avx512vl(auVar109,local_180,auVar97);
        auVar98 = vfmadd213ps_avx512vl(auVar111,local_160,auVar97);
        auVar97 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1210);
        auVar111 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1694);
        auVar109 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1b18);
        auVar107 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1f9c);
        auVar98 = vfmadd213ps_avx512vl(auVar95,local_480,auVar98);
        auVar197._0_4_ = fVar148 * auVar107._0_4_;
        auVar197._4_4_ = fVar148 * auVar107._4_4_;
        auVar197._8_4_ = fVar148 * auVar107._8_4_;
        auVar197._12_4_ = fVar148 * auVar107._12_4_;
        auVar197._16_4_ = fVar148 * auVar107._16_4_;
        auVar197._20_4_ = fVar148 * auVar107._20_4_;
        auVar197._24_4_ = fVar148 * auVar107._24_4_;
        auVar197._28_4_ = 0;
        auVar95 = vmulps_avx512vl(_local_3c0,auVar107);
        auVar107 = vmulps_avx512vl(local_1a0,auVar107);
        auVar108 = vfmadd231ps_avx512vl(auVar197,auVar109,local_360);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar109,local_380);
        auVar109 = vfmadd231ps_avx512vl(auVar107,local_180,auVar109);
        auVar107 = vfmadd231ps_avx512vl(auVar108,auVar111,local_320);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar111,local_340);
        auVar108 = vfmadd231ps_avx512vl(auVar109,local_160,auVar111);
        auVar89 = vfmadd231ps_fma(auVar107,auVar97,local_2e0);
        auVar107 = vfmadd231ps_avx512vl(auVar95,auVar97,local_300);
        auVar95 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1210);
        auVar111 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1b18);
        auVar109 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1f9c);
        auVar108 = vfmadd231ps_avx512vl(auVar108,local_480,auVar97);
        auVar37._4_4_ = fVar148 * auVar109._4_4_;
        auVar37._0_4_ = fVar148 * auVar109._0_4_;
        auVar37._8_4_ = fVar148 * auVar109._8_4_;
        auVar37._12_4_ = fVar148 * auVar109._12_4_;
        auVar37._16_4_ = fVar148 * auVar109._16_4_;
        auVar37._20_4_ = fVar148 * auVar109._20_4_;
        auVar37._24_4_ = fVar148 * auVar109._24_4_;
        auVar37._28_4_ = auVar97._28_4_;
        auVar97 = vmulps_avx512vl(_local_3c0,auVar109);
        auVar212 = ZEXT3264(local_480);
        auVar109 = vmulps_avx512vl(local_1a0,auVar109);
        auVar110 = vfmadd231ps_avx512vl(auVar37,auVar111,local_360);
        auVar102 = vfmadd231ps_avx512vl(auVar97,auVar111,local_380);
        auVar111 = vfmadd231ps_avx512vl(auVar109,local_180,auVar111);
        auVar97 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1694);
        auVar109 = vfmadd231ps_avx512vl(auVar110,auVar97,local_320);
        auVar110 = vfmadd231ps_avx512vl(auVar102,auVar97,local_340);
        auVar97 = vfmadd231ps_avx512vl(auVar111,local_160,auVar97);
        auVar88 = vfmadd231ps_fma(auVar109,auVar95,local_2e0);
        auVar111 = vfmadd231ps_avx512vl(auVar110,auVar95,local_300);
        auVar109 = vfmadd231ps_avx512vl(auVar97,local_480,auVar95);
        auVar210._8_4_ = 0x7fffffff;
        auVar210._0_8_ = 0x7fffffff7fffffff;
        auVar210._12_4_ = 0x7fffffff;
        auVar210._16_4_ = 0x7fffffff;
        auVar210._20_4_ = 0x7fffffff;
        auVar210._24_4_ = 0x7fffffff;
        auVar210._28_4_ = 0x7fffffff;
        auVar97 = vandps_avx(ZEXT1632(auVar89),auVar210);
        auVar95 = vandps_avx(auVar107,auVar210);
        auVar95 = vmaxps_avx(auVar97,auVar95);
        auVar97 = vandps_avx(auVar108,auVar210);
        auVar97 = vmaxps_avx(auVar95,auVar97);
        auVar204._4_4_ = fVar170;
        auVar204._0_4_ = fVar170;
        auVar204._8_4_ = fVar170;
        auVar204._12_4_ = fVar170;
        auVar204._16_4_ = fVar170;
        auVar204._20_4_ = fVar170;
        auVar204._24_4_ = fVar170;
        auVar204._28_4_ = fVar170;
        uVar74 = vcmpps_avx512vl(auVar97,auVar204,1);
        bVar15 = (bool)((byte)uVar74 & 1);
        auVar112._0_4_ = (float)((uint)bVar15 * auVar92._0_4_ | (uint)!bVar15 * auVar89._0_4_);
        bVar15 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar15 * auVar92._4_4_ | (uint)!bVar15 * auVar89._4_4_);
        bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar15 * auVar92._8_4_ | (uint)!bVar15 * auVar89._8_4_);
        bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar15 * auVar92._12_4_ | (uint)!bVar15 * auVar89._12_4_);
        fVar170 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar92._16_4_);
        auVar112._16_4_ = fVar170;
        fVar148 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar92._20_4_);
        auVar112._20_4_ = fVar148;
        fVar159 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar92._24_4_);
        auVar112._24_4_ = fVar159;
        uVar75 = (uint)(byte)(uVar74 >> 7) * auVar92._28_4_;
        auVar112._28_4_ = uVar75;
        bVar15 = (bool)((byte)uVar74 & 1);
        auVar113._0_4_ = (float)((uint)bVar15 * auVar93._0_4_ | (uint)!bVar15 * auVar107._0_4_);
        bVar15 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar15 * auVar93._4_4_ | (uint)!bVar15 * auVar107._4_4_);
        bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar15 * auVar93._8_4_ | (uint)!bVar15 * auVar107._8_4_);
        bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar15 * auVar93._12_4_ | (uint)!bVar15 * auVar107._12_4_);
        bVar15 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar113._16_4_ = (float)((uint)bVar15 * auVar93._16_4_ | (uint)!bVar15 * auVar107._16_4_);
        bVar15 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar113._20_4_ = (float)((uint)bVar15 * auVar93._20_4_ | (uint)!bVar15 * auVar107._20_4_);
        bVar15 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar113._24_4_ = (float)((uint)bVar15 * auVar93._24_4_ | (uint)!bVar15 * auVar107._24_4_);
        bVar15 = SUB81(uVar74 >> 7,0);
        auVar113._28_4_ = (uint)bVar15 * auVar93._28_4_ | (uint)!bVar15 * auVar107._28_4_;
        auVar97 = vandps_avx(auVar210,ZEXT1632(auVar88));
        auVar95 = vandps_avx(auVar111,auVar210);
        auVar95 = vmaxps_avx(auVar97,auVar95);
        auVar97 = vandps_avx(auVar109,auVar210);
        auVar97 = vmaxps_avx(auVar95,auVar97);
        uVar74 = vcmpps_avx512vl(auVar97,auVar204,1);
        bVar15 = (bool)((byte)uVar74 & 1);
        auVar114._0_4_ = (float)((uint)bVar15 * auVar92._0_4_ | (uint)!bVar15 * auVar88._0_4_);
        bVar15 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar15 * auVar92._4_4_ | (uint)!bVar15 * auVar88._4_4_);
        bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar15 * auVar92._8_4_ | (uint)!bVar15 * auVar88._8_4_);
        bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar15 * auVar92._12_4_ | (uint)!bVar15 * auVar88._12_4_);
        fVar137 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar92._16_4_);
        auVar114._16_4_ = fVar137;
        fVar84 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar92._20_4_);
        auVar114._20_4_ = fVar84;
        fVar83 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar92._24_4_);
        auVar114._24_4_ = fVar83;
        auVar114._28_4_ = (uint)(byte)(uVar74 >> 7) * auVar92._28_4_;
        bVar15 = (bool)((byte)uVar74 & 1);
        auVar115._0_4_ = (float)((uint)bVar15 * auVar93._0_4_ | (uint)!bVar15 * auVar111._0_4_);
        bVar15 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar15 * auVar93._4_4_ | (uint)!bVar15 * auVar111._4_4_);
        bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar15 * auVar93._8_4_ | (uint)!bVar15 * auVar111._8_4_);
        bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar15 * auVar93._12_4_ | (uint)!bVar15 * auVar111._12_4_);
        bVar15 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar115._16_4_ = (float)((uint)bVar15 * auVar93._16_4_ | (uint)!bVar15 * auVar111._16_4_);
        bVar15 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar115._20_4_ = (float)((uint)bVar15 * auVar93._20_4_ | (uint)!bVar15 * auVar111._20_4_);
        bVar15 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar115._24_4_ = (float)((uint)bVar15 * auVar93._24_4_ | (uint)!bVar15 * auVar111._24_4_);
        bVar15 = SUB81(uVar74 >> 7,0);
        auVar115._28_4_ = (uint)bVar15 * auVar93._28_4_ | (uint)!bVar15 * auVar111._28_4_;
        auVar90 = vxorps_avx512vl(local_320._0_16_,local_320._0_16_);
        auVar97 = vfmadd213ps_avx512vl(auVar112,auVar112,ZEXT1632(auVar90));
        auVar89 = vfmadd231ps_fma(auVar97,auVar113,auVar113);
        auVar97 = vrsqrt14ps_avx512vl(ZEXT1632(auVar89));
        fVar138 = auVar97._0_4_;
        fVar141 = auVar97._4_4_;
        fVar169 = auVar97._8_4_;
        fVar144 = auVar97._12_4_;
        fVar145 = auVar97._16_4_;
        fVar139 = auVar97._20_4_;
        fVar140 = auVar97._24_4_;
        auVar38._4_4_ = fVar141 * fVar141 * fVar141 * auVar89._4_4_ * -0.5;
        auVar38._0_4_ = fVar138 * fVar138 * fVar138 * auVar89._0_4_ * -0.5;
        auVar38._8_4_ = fVar169 * fVar169 * fVar169 * auVar89._8_4_ * -0.5;
        auVar38._12_4_ = fVar144 * fVar144 * fVar144 * auVar89._12_4_ * -0.5;
        auVar38._16_4_ = fVar145 * fVar145 * fVar145 * -0.0;
        auVar38._20_4_ = fVar139 * fVar139 * fVar139 * -0.0;
        auVar38._24_4_ = fVar140 * fVar140 * fVar140 * -0.0;
        auVar38._28_4_ = 0;
        auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar111 = vfmadd231ps_avx512vl(auVar38,auVar95,auVar97);
        auVar39._4_4_ = auVar113._4_4_ * auVar111._4_4_;
        auVar39._0_4_ = auVar113._0_4_ * auVar111._0_4_;
        auVar39._8_4_ = auVar113._8_4_ * auVar111._8_4_;
        auVar39._12_4_ = auVar113._12_4_ * auVar111._12_4_;
        auVar39._16_4_ = auVar113._16_4_ * auVar111._16_4_;
        auVar39._20_4_ = auVar113._20_4_ * auVar111._20_4_;
        auVar39._24_4_ = auVar113._24_4_ * auVar111._24_4_;
        auVar39._28_4_ = auVar97._28_4_;
        auVar40._4_4_ = auVar111._4_4_ * -auVar112._4_4_;
        auVar40._0_4_ = auVar111._0_4_ * -auVar112._0_4_;
        auVar40._8_4_ = auVar111._8_4_ * -auVar112._8_4_;
        auVar40._12_4_ = auVar111._12_4_ * -auVar112._12_4_;
        auVar40._16_4_ = auVar111._16_4_ * -fVar170;
        auVar40._20_4_ = auVar111._20_4_ * -fVar148;
        auVar40._24_4_ = auVar111._24_4_ * -fVar159;
        auVar40._28_4_ = uVar75 ^ 0x80000000;
        auVar97 = vmulps_avx512vl(auVar111,ZEXT1632(auVar90));
        auVar92 = ZEXT1632(auVar90);
        auVar109 = vfmadd213ps_avx512vl(auVar114,auVar114,auVar92);
        auVar89 = vfmadd231ps_fma(auVar109,auVar115,auVar115);
        auVar109 = vrsqrt14ps_avx512vl(ZEXT1632(auVar89));
        fVar170 = auVar109._0_4_;
        fVar148 = auVar109._4_4_;
        fVar159 = auVar109._8_4_;
        fVar138 = auVar109._12_4_;
        fVar141 = auVar109._16_4_;
        fVar169 = auVar109._20_4_;
        fVar144 = auVar109._24_4_;
        auVar41._4_4_ = fVar148 * fVar148 * fVar148 * auVar89._4_4_ * -0.5;
        auVar41._0_4_ = fVar170 * fVar170 * fVar170 * auVar89._0_4_ * -0.5;
        auVar41._8_4_ = fVar159 * fVar159 * fVar159 * auVar89._8_4_ * -0.5;
        auVar41._12_4_ = fVar138 * fVar138 * fVar138 * auVar89._12_4_ * -0.5;
        auVar41._16_4_ = fVar141 * fVar141 * fVar141 * -0.0;
        auVar41._20_4_ = fVar169 * fVar169 * fVar169 * -0.0;
        auVar41._24_4_ = fVar144 * fVar144 * fVar144 * -0.0;
        auVar41._28_4_ = 0;
        auVar95 = vfmadd231ps_avx512vl(auVar41,auVar95,auVar109);
        auVar42._4_4_ = auVar115._4_4_ * auVar95._4_4_;
        auVar42._0_4_ = auVar115._0_4_ * auVar95._0_4_;
        auVar42._8_4_ = auVar115._8_4_ * auVar95._8_4_;
        auVar42._12_4_ = auVar115._12_4_ * auVar95._12_4_;
        auVar42._16_4_ = auVar115._16_4_ * auVar95._16_4_;
        auVar42._20_4_ = auVar115._20_4_ * auVar95._20_4_;
        auVar42._24_4_ = auVar115._24_4_ * auVar95._24_4_;
        auVar42._28_4_ = auVar109._28_4_;
        auVar43._4_4_ = -auVar114._4_4_ * auVar95._4_4_;
        auVar43._0_4_ = -auVar114._0_4_ * auVar95._0_4_;
        auVar43._8_4_ = -auVar114._8_4_ * auVar95._8_4_;
        auVar43._12_4_ = -auVar114._12_4_ * auVar95._12_4_;
        auVar43._16_4_ = -fVar137 * auVar95._16_4_;
        auVar43._20_4_ = -fVar84 * auVar95._20_4_;
        auVar43._24_4_ = -fVar83 * auVar95._24_4_;
        auVar43._28_4_ = auVar111._28_4_;
        auVar95 = vmulps_avx512vl(auVar95,auVar92);
        auVar89 = vfmadd213ps_fma(auVar39,auVar103,auVar99);
        auVar88 = vfmadd213ps_fma(auVar40,auVar103,auVar94);
        auVar111 = vfmadd213ps_avx512vl(auVar97,auVar103,auVar98);
        auVar109 = vfmadd213ps_avx512vl(auVar42,auVar104,auVar100);
        auVar9 = vfnmadd213ps_fma(auVar39,auVar103,auVar99);
        auVar87 = vfmadd213ps_fma(auVar43,auVar104,auVar101);
        auVar10 = vfnmadd213ps_fma(auVar40,auVar103,auVar94);
        auVar107 = vfmadd213ps_avx512vl(auVar95,auVar104,auVar96);
        auVar98 = vfnmadd231ps_avx512vl(auVar98,auVar103,auVar97);
        auVar11 = vfnmadd213ps_fma(auVar42,auVar104,auVar100);
        auVar86 = vfnmadd213ps_fma(auVar43,auVar104,auVar101);
        auVar95 = vfnmadd231ps_avx512vl(auVar96,auVar104,auVar95);
        auVar96 = vsubps_avx512vl(auVar109,ZEXT1632(auVar9));
        auVar97 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar10));
        auVar108 = vsubps_avx512vl(auVar107,auVar98);
        auVar110 = vmulps_avx512vl(auVar97,auVar98);
        auVar8 = vfmsub231ps_fma(auVar110,ZEXT1632(auVar10),auVar108);
        auVar44._4_4_ = auVar9._4_4_ * auVar108._4_4_;
        auVar44._0_4_ = auVar9._0_4_ * auVar108._0_4_;
        auVar44._8_4_ = auVar9._8_4_ * auVar108._8_4_;
        auVar44._12_4_ = auVar9._12_4_ * auVar108._12_4_;
        auVar44._16_4_ = auVar108._16_4_ * 0.0;
        auVar44._20_4_ = auVar108._20_4_ * 0.0;
        auVar44._24_4_ = auVar108._24_4_ * 0.0;
        auVar44._28_4_ = auVar108._28_4_;
        auVar108 = vfmsub231ps_avx512vl(auVar44,auVar98,auVar96);
        auVar45._4_4_ = auVar10._4_4_ * auVar96._4_4_;
        auVar45._0_4_ = auVar10._0_4_ * auVar96._0_4_;
        auVar45._8_4_ = auVar10._8_4_ * auVar96._8_4_;
        auVar45._12_4_ = auVar10._12_4_ * auVar96._12_4_;
        auVar45._16_4_ = auVar96._16_4_ * 0.0;
        auVar45._20_4_ = auVar96._20_4_ * 0.0;
        auVar45._24_4_ = auVar96._24_4_ * 0.0;
        auVar45._28_4_ = auVar96._28_4_;
        auVar85 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar9),auVar97);
        auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar92,auVar108);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar92,ZEXT1632(auVar8));
        auVar100 = ZEXT1632(auVar90);
        uVar74 = vcmpps_avx512vl(auVar97,auVar100,2);
        bVar73 = (byte)uVar74;
        fVar83 = (float)((uint)(bVar73 & 1) * auVar89._0_4_ |
                        (uint)!(bool)(bVar73 & 1) * auVar11._0_4_);
        bVar15 = (bool)((byte)(uVar74 >> 1) & 1);
        fVar137 = (float)((uint)bVar15 * auVar89._4_4_ | (uint)!bVar15 * auVar11._4_4_);
        bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
        fVar141 = (float)((uint)bVar15 * auVar89._8_4_ | (uint)!bVar15 * auVar11._8_4_);
        bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
        fVar144 = (float)((uint)bVar15 * auVar89._12_4_ | (uint)!bVar15 * auVar11._12_4_);
        auVar96 = ZEXT1632(CONCAT412(fVar144,CONCAT48(fVar141,CONCAT44(fVar137,fVar83))));
        fVar84 = (float)((uint)(bVar73 & 1) * auVar88._0_4_ |
                        (uint)!(bool)(bVar73 & 1) * auVar86._0_4_);
        bVar15 = (bool)((byte)(uVar74 >> 1) & 1);
        fVar138 = (float)((uint)bVar15 * auVar88._4_4_ | (uint)!bVar15 * auVar86._4_4_);
        bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
        fVar169 = (float)((uint)bVar15 * auVar88._8_4_ | (uint)!bVar15 * auVar86._8_4_);
        bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
        fVar145 = (float)((uint)bVar15 * auVar88._12_4_ | (uint)!bVar15 * auVar86._12_4_);
        auVar108 = ZEXT1632(CONCAT412(fVar145,CONCAT48(fVar169,CONCAT44(fVar138,fVar84))));
        auVar116._0_4_ =
             (uint)(bVar73 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar95._0_4_;
        bVar15 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar116._4_4_ = (uint)bVar15 * auVar111._4_4_ | (uint)!bVar15 * auVar95._4_4_;
        bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar116._8_4_ = (uint)bVar15 * auVar111._8_4_ | (uint)!bVar15 * auVar95._8_4_;
        bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar116._12_4_ = (uint)bVar15 * auVar111._12_4_ | (uint)!bVar15 * auVar95._12_4_;
        bVar15 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar116._16_4_ = (uint)bVar15 * auVar111._16_4_ | (uint)!bVar15 * auVar95._16_4_;
        bVar15 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar116._20_4_ = (uint)bVar15 * auVar111._20_4_ | (uint)!bVar15 * auVar95._20_4_;
        bVar15 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar116._24_4_ = (uint)bVar15 * auVar111._24_4_ | (uint)!bVar15 * auVar95._24_4_;
        bVar15 = SUB81(uVar74 >> 7,0);
        auVar116._28_4_ = (uint)bVar15 * auVar111._28_4_ | (uint)!bVar15 * auVar95._28_4_;
        auVar95 = vblendmps_avx512vl(ZEXT1632(auVar9),auVar109);
        auVar117._0_4_ =
             (uint)(bVar73 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar8._0_4_;
        bVar15 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar117._4_4_ = (uint)bVar15 * auVar95._4_4_ | (uint)!bVar15 * auVar8._4_4_;
        bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar117._8_4_ = (uint)bVar15 * auVar95._8_4_ | (uint)!bVar15 * auVar8._8_4_;
        bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar117._12_4_ = (uint)bVar15 * auVar95._12_4_ | (uint)!bVar15 * auVar8._12_4_;
        auVar117._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * auVar95._16_4_;
        auVar117._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * auVar95._20_4_;
        auVar117._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * auVar95._24_4_;
        auVar117._28_4_ = (uint)(byte)(uVar74 >> 7) * auVar95._28_4_;
        auVar95 = vblendmps_avx512vl(ZEXT1632(auVar10),ZEXT1632(auVar87));
        auVar118._0_4_ =
             (float)((uint)(bVar73 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar88._0_4_)
        ;
        bVar15 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar15 * auVar95._4_4_ | (uint)!bVar15 * auVar88._4_4_);
        bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar15 * auVar95._8_4_ | (uint)!bVar15 * auVar88._8_4_);
        bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar15 * auVar95._12_4_ | (uint)!bVar15 * auVar88._12_4_);
        fVar170 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar95._16_4_);
        auVar118._16_4_ = fVar170;
        fVar159 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar95._20_4_);
        auVar118._20_4_ = fVar159;
        fVar148 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar95._24_4_);
        auVar118._24_4_ = fVar148;
        auVar118._28_4_ = (uint)(byte)(uVar74 >> 7) * auVar95._28_4_;
        auVar95 = vblendmps_avx512vl(auVar98,auVar107);
        auVar119._0_4_ =
             (float)((uint)(bVar73 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar111._0_4_
                    );
        bVar15 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar15 * auVar95._4_4_ | (uint)!bVar15 * auVar111._4_4_);
        bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar15 * auVar95._8_4_ | (uint)!bVar15 * auVar111._8_4_);
        bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar15 * auVar95._12_4_ | (uint)!bVar15 * auVar111._12_4_);
        bVar15 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar119._16_4_ = (float)((uint)bVar15 * auVar95._16_4_ | (uint)!bVar15 * auVar111._16_4_);
        bVar15 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar119._20_4_ = (float)((uint)bVar15 * auVar95._20_4_ | (uint)!bVar15 * auVar111._20_4_);
        bVar15 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar119._24_4_ = (float)((uint)bVar15 * auVar95._24_4_ | (uint)!bVar15 * auVar111._24_4_);
        bVar15 = SUB81(uVar74 >> 7,0);
        auVar119._28_4_ = (uint)bVar15 * auVar95._28_4_ | (uint)!bVar15 * auVar111._28_4_;
        auVar120._0_4_ =
             (uint)(bVar73 & 1) * (int)auVar9._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar109._0_4_;
        bVar15 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar120._4_4_ = (uint)bVar15 * (int)auVar9._4_4_ | (uint)!bVar15 * auVar109._4_4_;
        bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar120._8_4_ = (uint)bVar15 * (int)auVar9._8_4_ | (uint)!bVar15 * auVar109._8_4_;
        bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar120._12_4_ = (uint)bVar15 * (int)auVar9._12_4_ | (uint)!bVar15 * auVar109._12_4_;
        auVar120._16_4_ = (uint)!(bool)((byte)(uVar74 >> 4) & 1) * auVar109._16_4_;
        auVar120._20_4_ = (uint)!(bool)((byte)(uVar74 >> 5) & 1) * auVar109._20_4_;
        auVar120._24_4_ = (uint)!(bool)((byte)(uVar74 >> 6) & 1) * auVar109._24_4_;
        auVar120._28_4_ = (uint)!SUB81(uVar74 >> 7,0) * auVar109._28_4_;
        bVar15 = (bool)((byte)(uVar74 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar74 >> 2) & 1);
        bVar18 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar121._0_4_ =
             (uint)(bVar73 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar107._0_4_;
        bVar16 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar121._4_4_ = (uint)bVar16 * auVar98._4_4_ | (uint)!bVar16 * auVar107._4_4_;
        bVar16 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar121._8_4_ = (uint)bVar16 * auVar98._8_4_ | (uint)!bVar16 * auVar107._8_4_;
        bVar16 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar121._12_4_ = (uint)bVar16 * auVar98._12_4_ | (uint)!bVar16 * auVar107._12_4_;
        bVar16 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar121._16_4_ = (uint)bVar16 * auVar98._16_4_ | (uint)!bVar16 * auVar107._16_4_;
        bVar16 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar121._20_4_ = (uint)bVar16 * auVar98._20_4_ | (uint)!bVar16 * auVar107._20_4_;
        bVar16 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar121._24_4_ = (uint)bVar16 * auVar98._24_4_ | (uint)!bVar16 * auVar107._24_4_;
        bVar16 = SUB81(uVar74 >> 7,0);
        auVar121._28_4_ = (uint)bVar16 * auVar98._28_4_ | (uint)!bVar16 * auVar107._28_4_;
        auVar107 = vsubps_avx512vl(auVar120,auVar96);
        auVar95 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar10._12_4_ |
                                                (uint)!bVar18 * auVar87._12_4_,
                                                CONCAT48((uint)bVar17 * (int)auVar10._8_4_ |
                                                         (uint)!bVar17 * auVar87._8_4_,
                                                         CONCAT44((uint)bVar15 * (int)auVar10._4_4_
                                                                  | (uint)!bVar15 * auVar87._4_4_,
                                                                  (uint)(bVar73 & 1) *
                                                                  (int)auVar10._0_4_ |
                                                                  (uint)!(bool)(bVar73 & 1) *
                                                                  auVar87._0_4_)))),auVar108);
        auVar190 = ZEXT3264(auVar95);
        auVar98 = vsubps_avx512vl(auVar121,auVar116);
        auVar111 = vsubps_avx(auVar96,auVar117);
        auVar194 = ZEXT3264(auVar111);
        auVar109 = vsubps_avx(auVar108,auVar118);
        auVar110 = vsubps_avx512vl(auVar116,auVar119);
        auVar46._4_4_ = auVar98._4_4_ * fVar137;
        auVar46._0_4_ = auVar98._0_4_ * fVar83;
        auVar46._8_4_ = auVar98._8_4_ * fVar141;
        auVar46._12_4_ = auVar98._12_4_ * fVar144;
        auVar46._16_4_ = auVar98._16_4_ * 0.0;
        auVar46._20_4_ = auVar98._20_4_ * 0.0;
        auVar46._24_4_ = auVar98._24_4_ * 0.0;
        auVar46._28_4_ = auVar121._28_4_;
        auVar99 = vfmsub231ps_avx512vl(auVar46,auVar116,auVar107);
        auVar47._4_4_ = fVar138 * auVar107._4_4_;
        auVar47._0_4_ = fVar84 * auVar107._0_4_;
        auVar47._8_4_ = fVar169 * auVar107._8_4_;
        auVar47._12_4_ = fVar145 * auVar107._12_4_;
        auVar47._16_4_ = auVar107._16_4_ * 0.0;
        auVar47._20_4_ = auVar107._20_4_ * 0.0;
        auVar47._24_4_ = auVar107._24_4_ * 0.0;
        auVar47._28_4_ = auVar97._28_4_;
        auVar89 = vfmsub231ps_fma(auVar47,auVar96,auVar95);
        auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar100,auVar99);
        auVar99 = vmulps_avx512vl(auVar95,auVar116);
        auVar89 = vfmsub231ps_fma(auVar99,auVar108,auVar98);
        auVar99 = vfmadd231ps_avx512vl(auVar97,auVar100,ZEXT1632(auVar89));
        auVar97 = vmulps_avx512vl(auVar110,auVar117);
        auVar97 = vfmsub231ps_avx512vl(auVar97,auVar111,auVar119);
        auVar48._4_4_ = auVar109._4_4_ * auVar119._4_4_;
        auVar48._0_4_ = auVar109._0_4_ * auVar119._0_4_;
        auVar48._8_4_ = auVar109._8_4_ * auVar119._8_4_;
        auVar48._12_4_ = auVar109._12_4_ * auVar119._12_4_;
        auVar48._16_4_ = auVar109._16_4_ * auVar119._16_4_;
        auVar48._20_4_ = auVar109._20_4_ * auVar119._20_4_;
        auVar48._24_4_ = auVar109._24_4_ * auVar119._24_4_;
        auVar48._28_4_ = auVar119._28_4_;
        auVar89 = vfmsub231ps_fma(auVar48,auVar118,auVar110);
        auVar180._0_4_ = auVar118._0_4_ * auVar111._0_4_;
        auVar180._4_4_ = auVar118._4_4_ * auVar111._4_4_;
        auVar180._8_4_ = auVar118._8_4_ * auVar111._8_4_;
        auVar180._12_4_ = auVar118._12_4_ * auVar111._12_4_;
        auVar180._16_4_ = fVar170 * auVar111._16_4_;
        auVar180._20_4_ = fVar159 * auVar111._20_4_;
        auVar180._24_4_ = fVar148 * auVar111._24_4_;
        auVar180._28_4_ = 0;
        auVar88 = vfmsub231ps_fma(auVar180,auVar109,auVar117);
        auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar100,auVar97);
        auVar94 = vfmadd231ps_avx512vl(auVar97,auVar100,ZEXT1632(auVar89));
        auVar185 = ZEXT3264(auVar94);
        auVar97 = vmaxps_avx(auVar99,auVar94);
        uVar21 = vcmpps_avx512vl(auVar97,auVar100,2);
        bVar82 = bVar82 & (byte)uVar21;
        if (bVar82 != 0) {
          auVar49._4_4_ = auVar110._4_4_ * auVar95._4_4_;
          auVar49._0_4_ = auVar110._0_4_ * auVar95._0_4_;
          auVar49._8_4_ = auVar110._8_4_ * auVar95._8_4_;
          auVar49._12_4_ = auVar110._12_4_ * auVar95._12_4_;
          auVar49._16_4_ = auVar110._16_4_ * auVar95._16_4_;
          auVar49._20_4_ = auVar110._20_4_ * auVar95._20_4_;
          auVar49._24_4_ = auVar110._24_4_ * auVar95._24_4_;
          auVar49._28_4_ = auVar97._28_4_;
          auVar8 = vfmsub231ps_fma(auVar49,auVar109,auVar98);
          auVar50._4_4_ = auVar98._4_4_ * auVar111._4_4_;
          auVar50._0_4_ = auVar98._0_4_ * auVar111._0_4_;
          auVar50._8_4_ = auVar98._8_4_ * auVar111._8_4_;
          auVar50._12_4_ = auVar98._12_4_ * auVar111._12_4_;
          auVar50._16_4_ = auVar98._16_4_ * auVar111._16_4_;
          auVar50._20_4_ = auVar98._20_4_ * auVar111._20_4_;
          auVar50._24_4_ = auVar98._24_4_ * auVar111._24_4_;
          auVar50._28_4_ = auVar98._28_4_;
          auVar87 = vfmsub231ps_fma(auVar50,auVar107,auVar110);
          auVar51._4_4_ = auVar109._4_4_ * auVar107._4_4_;
          auVar51._0_4_ = auVar109._0_4_ * auVar107._0_4_;
          auVar51._8_4_ = auVar109._8_4_ * auVar107._8_4_;
          auVar51._12_4_ = auVar109._12_4_ * auVar107._12_4_;
          auVar51._16_4_ = auVar109._16_4_ * auVar107._16_4_;
          auVar51._20_4_ = auVar109._20_4_ * auVar107._20_4_;
          auVar51._24_4_ = auVar109._24_4_ * auVar107._24_4_;
          auVar51._28_4_ = auVar109._28_4_;
          auVar85 = vfmsub231ps_fma(auVar51,auVar111,auVar95);
          auVar89 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar87),ZEXT1632(auVar85));
          auVar88 = vfmadd231ps_fma(ZEXT1632(auVar89),ZEXT1632(auVar8),ZEXT1232(ZEXT412(0)) << 0x20)
          ;
          auVar97 = vrcp14ps_avx512vl(ZEXT1632(auVar88));
          auVar194 = ZEXT3264(auVar97);
          auVar26._8_4_ = 0x3f800000;
          auVar26._0_8_ = 0x3f8000003f800000;
          auVar26._12_4_ = 0x3f800000;
          auVar26._16_4_ = 0x3f800000;
          auVar26._20_4_ = 0x3f800000;
          auVar26._24_4_ = 0x3f800000;
          auVar26._28_4_ = 0x3f800000;
          auVar95 = vfnmadd213ps_avx512vl(auVar97,ZEXT1632(auVar88),auVar26);
          auVar89 = vfmadd132ps_fma(auVar95,auVar97,auVar97);
          auVar190 = ZEXT1664(auVar89);
          auVar97 = vmulps_avx512vl(auVar116,ZEXT1632(auVar85));
          auVar87 = vfmadd231ps_fma(auVar97,auVar108,ZEXT1632(auVar87));
          auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar96,ZEXT1632(auVar8));
          fVar148 = auVar89._0_4_;
          fVar159 = auVar89._4_4_;
          fVar83 = auVar89._8_4_;
          fVar84 = auVar89._12_4_;
          local_280 = ZEXT1632(CONCAT412(auVar87._12_4_ * fVar84,
                                         CONCAT48(auVar87._8_4_ * fVar83,
                                                  CONCAT44(auVar87._4_4_ * fVar159,
                                                           auVar87._0_4_ * fVar148))));
          auVar208 = ZEXT3264(local_280);
          auVar152._8_4_ = 3;
          auVar152._0_8_ = 0x300000003;
          auVar152._12_4_ = 3;
          auVar152._16_4_ = 3;
          auVar152._20_4_ = 3;
          auVar152._24_4_ = 3;
          auVar152._28_4_ = 3;
          auVar97 = vpermps_avx2(auVar152,ZEXT1632((undefined1  [16])aVar5));
          uVar21 = vcmpps_avx512vl(auVar97,local_280,2);
          fVar170 = (ray->super_RayK<1>).tfar;
          auVar27._4_4_ = fVar170;
          auVar27._0_4_ = fVar170;
          auVar27._8_4_ = fVar170;
          auVar27._12_4_ = fVar170;
          auVar27._16_4_ = fVar170;
          auVar27._20_4_ = fVar170;
          auVar27._24_4_ = fVar170;
          auVar27._28_4_ = fVar170;
          uVar23 = vcmpps_avx512vl(local_280,auVar27,2);
          bVar82 = (byte)uVar21 & (byte)uVar23 & bVar82;
          if (bVar82 != 0) {
            uVar81 = vcmpps_avx512vl(ZEXT1632(auVar88),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar81 = bVar82 & uVar81;
            if ((char)uVar81 != '\0') {
              fVar170 = auVar99._0_4_ * fVar148;
              fVar137 = auVar99._4_4_ * fVar159;
              auVar52._4_4_ = fVar137;
              auVar52._0_4_ = fVar170;
              fVar138 = auVar99._8_4_ * fVar83;
              auVar52._8_4_ = fVar138;
              fVar141 = auVar99._12_4_ * fVar84;
              auVar52._12_4_ = fVar141;
              fVar169 = auVar99._16_4_ * 0.0;
              auVar52._16_4_ = fVar169;
              fVar144 = auVar99._20_4_ * 0.0;
              auVar52._20_4_ = fVar144;
              fVar145 = auVar99._24_4_ * 0.0;
              auVar52._24_4_ = fVar145;
              auVar52._28_4_ = auVar99._28_4_;
              auVar153._8_4_ = 0x3f800000;
              auVar153._0_8_ = 0x3f8000003f800000;
              auVar153._12_4_ = 0x3f800000;
              auVar153._16_4_ = 0x3f800000;
              auVar153._20_4_ = 0x3f800000;
              auVar153._24_4_ = 0x3f800000;
              auVar153._28_4_ = 0x3f800000;
              auVar97 = vsubps_avx(auVar153,auVar52);
              local_2c0._0_4_ =
                   (float)((uint)(bVar73 & 1) * (int)fVar170 |
                          (uint)!(bool)(bVar73 & 1) * auVar97._0_4_);
              bVar15 = (bool)((byte)(uVar74 >> 1) & 1);
              local_2c0._4_4_ = (float)((uint)bVar15 * (int)fVar137 | (uint)!bVar15 * auVar97._4_4_)
              ;
              bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
              local_2c0._8_4_ = (float)((uint)bVar15 * (int)fVar138 | (uint)!bVar15 * auVar97._8_4_)
              ;
              bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
              local_2c0._12_4_ =
                   (float)((uint)bVar15 * (int)fVar141 | (uint)!bVar15 * auVar97._12_4_);
              bVar15 = (bool)((byte)(uVar74 >> 4) & 1);
              local_2c0._16_4_ =
                   (float)((uint)bVar15 * (int)fVar169 | (uint)!bVar15 * auVar97._16_4_);
              bVar15 = (bool)((byte)(uVar74 >> 5) & 1);
              local_2c0._20_4_ =
                   (float)((uint)bVar15 * (int)fVar144 | (uint)!bVar15 * auVar97._20_4_);
              bVar15 = (bool)((byte)(uVar74 >> 6) & 1);
              local_2c0._24_4_ =
                   (float)((uint)bVar15 * (int)fVar145 | (uint)!bVar15 * auVar97._24_4_);
              bVar15 = SUB81(uVar74 >> 7,0);
              local_2c0._28_4_ =
                   (float)((uint)bVar15 * auVar99._28_4_ | (uint)!bVar15 * auVar97._28_4_);
              auVar97 = vsubps_avx(auVar104,auVar103);
              auVar89 = vfmadd213ps_fma(auVar97,local_2c0,auVar103);
              fVar170 = pre->depth_scale;
              auVar28._4_4_ = fVar170;
              auVar28._0_4_ = fVar170;
              auVar28._8_4_ = fVar170;
              auVar28._12_4_ = fVar170;
              auVar28._16_4_ = fVar170;
              auVar28._20_4_ = fVar170;
              auVar28._24_4_ = fVar170;
              auVar28._28_4_ = fVar170;
              auVar97 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar89._12_4_ + auVar89._12_4_,
                                                           CONCAT48(auVar89._8_4_ + auVar89._8_4_,
                                                                    CONCAT44(auVar89._4_4_ +
                                                                             auVar89._4_4_,
                                                                             auVar89._0_4_ +
                                                                             auVar89._0_4_)))),
                                        auVar28);
              uVar22 = vcmpps_avx512vl(local_280,auVar97,6);
              uVar81 = uVar81 & uVar22;
              bVar82 = (byte)uVar81;
              if (bVar82 != 0) {
                auVar167._0_4_ = auVar94._0_4_ * fVar148;
                auVar167._4_4_ = auVar94._4_4_ * fVar159;
                auVar167._8_4_ = auVar94._8_4_ * fVar83;
                auVar167._12_4_ = auVar94._12_4_ * fVar84;
                auVar167._16_4_ = auVar94._16_4_ * 0.0;
                auVar167._20_4_ = auVar94._20_4_ * 0.0;
                auVar167._24_4_ = auVar94._24_4_ * 0.0;
                auVar167._28_4_ = 0;
                auVar181._8_4_ = 0x3f800000;
                auVar181._0_8_ = 0x3f8000003f800000;
                auVar181._12_4_ = 0x3f800000;
                auVar181._16_4_ = 0x3f800000;
                auVar181._20_4_ = 0x3f800000;
                auVar181._24_4_ = 0x3f800000;
                auVar181._28_4_ = 0x3f800000;
                auVar185 = ZEXT3264(auVar181);
                auVar97 = vsubps_avx(auVar181,auVar167);
                auVar122._0_4_ =
                     (uint)(bVar73 & 1) * (int)auVar167._0_4_ |
                     (uint)!(bool)(bVar73 & 1) * auVar97._0_4_;
                bVar15 = (bool)((byte)(uVar74 >> 1) & 1);
                auVar122._4_4_ = (uint)bVar15 * (int)auVar167._4_4_ | (uint)!bVar15 * auVar97._4_4_;
                bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
                auVar122._8_4_ = (uint)bVar15 * (int)auVar167._8_4_ | (uint)!bVar15 * auVar97._8_4_;
                bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
                auVar122._12_4_ =
                     (uint)bVar15 * (int)auVar167._12_4_ | (uint)!bVar15 * auVar97._12_4_;
                bVar15 = (bool)((byte)(uVar74 >> 4) & 1);
                auVar122._16_4_ =
                     (uint)bVar15 * (int)auVar167._16_4_ | (uint)!bVar15 * auVar97._16_4_;
                bVar15 = (bool)((byte)(uVar74 >> 5) & 1);
                auVar122._20_4_ =
                     (uint)bVar15 * (int)auVar167._20_4_ | (uint)!bVar15 * auVar97._20_4_;
                bVar15 = (bool)((byte)(uVar74 >> 6) & 1);
                auVar122._24_4_ =
                     (uint)bVar15 * (int)auVar167._24_4_ | (uint)!bVar15 * auVar97._24_4_;
                auVar122._28_4_ = (uint)!SUB81(uVar74 >> 7,0) * auVar97._28_4_;
                auVar29._8_4_ = 0x40000000;
                auVar29._0_8_ = 0x4000000040000000;
                auVar29._12_4_ = 0x40000000;
                auVar29._16_4_ = 0x40000000;
                auVar29._20_4_ = 0x40000000;
                auVar29._24_4_ = 0x40000000;
                auVar29._28_4_ = 0x40000000;
                local_2a0 = vfmsub132ps_avx512vl(auVar122,auVar181,auVar29);
                local_260 = 0;
                local_25c = iVar13;
                auVar199 = ZEXT1664(local_4c0);
                local_250 = local_4c0;
                auVar201 = ZEXT1664(local_4d0);
                local_240 = local_4d0;
                local_230 = *(undefined8 *)*pauVar3;
                uStack_228 = *(undefined8 *)(*pauVar3 + 8);
                if ((pGVar78->mask & (ray->super_RayK<1>).mask) != 0) {
                  fVar170 = 1.0 / auVar205._0_4_;
                  local_200[0] = fVar170 * (local_2c0._0_4_ + 0.0);
                  local_200[1] = fVar170 * (local_2c0._4_4_ + 1.0);
                  local_200[2] = fVar170 * (local_2c0._8_4_ + 2.0);
                  local_200[3] = fVar170 * (local_2c0._12_4_ + 3.0);
                  fStack_1f0 = fVar170 * (local_2c0._16_4_ + 4.0);
                  fStack_1ec = fVar170 * (local_2c0._20_4_ + 5.0);
                  fStack_1e8 = fVar170 * (local_2c0._24_4_ + 6.0);
                  fStack_1e4 = local_2c0._28_4_ + 7.0;
                  local_1e0 = local_2a0;
                  local_1c0 = local_280;
                  auVar154._8_4_ = 0x7f800000;
                  auVar154._0_8_ = 0x7f8000007f800000;
                  auVar154._12_4_ = 0x7f800000;
                  auVar154._16_4_ = 0x7f800000;
                  auVar154._20_4_ = 0x7f800000;
                  auVar154._24_4_ = 0x7f800000;
                  auVar154._28_4_ = 0x7f800000;
                  auVar97 = vblendmps_avx512vl(auVar154,local_280);
                  auVar123._0_4_ =
                       (uint)(bVar82 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar82 & 1) * 0x7f800000;
                  bVar15 = (bool)((byte)(uVar81 >> 1) & 1);
                  auVar123._4_4_ = (uint)bVar15 * auVar97._4_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)((byte)(uVar81 >> 2) & 1);
                  auVar123._8_4_ = (uint)bVar15 * auVar97._8_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)((byte)(uVar81 >> 3) & 1);
                  auVar123._12_4_ = (uint)bVar15 * auVar97._12_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)((byte)(uVar81 >> 4) & 1);
                  auVar123._16_4_ = (uint)bVar15 * auVar97._16_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)((byte)(uVar81 >> 5) & 1);
                  auVar123._20_4_ = (uint)bVar15 * auVar97._20_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)((byte)(uVar81 >> 6) & 1);
                  auVar123._24_4_ = (uint)bVar15 * auVar97._24_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = SUB81(uVar81 >> 7,0);
                  auVar123._28_4_ = (uint)bVar15 * auVar97._28_4_ | (uint)!bVar15 * 0x7f800000;
                  auVar97 = vshufps_avx(auVar123,auVar123,0xb1);
                  auVar97 = vminps_avx(auVar123,auVar97);
                  auVar95 = vshufpd_avx(auVar97,auVar97,5);
                  auVar97 = vminps_avx(auVar97,auVar95);
                  auVar95 = vpermpd_avx2(auVar97,0x4e);
                  auVar97 = vminps_avx(auVar97,auVar95);
                  uVar21 = vcmpps_avx512vl(auVar123,auVar97,0);
                  uVar75 = (uint)uVar81;
                  if (((byte)uVar21 & bVar82) != 0) {
                    uVar75 = (uint)((byte)uVar21 & bVar82);
                  }
                  uVar24 = 0;
                  for (; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
                    uVar24 = uVar24 + 1;
                  }
                  uVar74 = (ulong)uVar24;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar78->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_400 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                    local_460 = local_280;
                    do {
                      local_4a4 = local_200[uVar74];
                      local_4a0 = *(undefined4 *)(local_1e0 + uVar74 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar74 * 4);
                      local_500.context = context->user;
                      fVar170 = 1.0 - local_4a4;
                      auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(local_4a4 * (fVar170 + fVar170))),
                                                ZEXT416((uint)fVar170),ZEXT416((uint)fVar170));
                      auVar88 = ZEXT416((uint)local_4a4);
                      auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar88,
                                                ZEXT416(0xc0a00000));
                      auVar87 = vfmadd231ss_fma(ZEXT416((uint)(local_4a4 * local_4a4 * 3.0)),
                                                ZEXT416((uint)(local_4a4 + local_4a4)),auVar89);
                      auVar194 = ZEXT1664(auVar87);
                      auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar88,
                                                ZEXT416(0x40000000));
                      auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar170 * fVar170 * -3.0)),
                                                ZEXT416((uint)(fVar170 + fVar170)),auVar89);
                      auVar88 = vfmadd231ss_fma(ZEXT416((uint)(local_4a4 * local_4a4)),auVar88,
                                                ZEXT416((uint)(fVar170 * -2.0)));
                      fVar170 = auVar8._0_4_ * 0.5;
                      fVar148 = auVar87._0_4_ * 0.5;
                      auVar185 = ZEXT464((uint)fVar148);
                      fVar159 = auVar89._0_4_ * 0.5;
                      fVar83 = auVar88._0_4_ * 0.5;
                      auVar177._0_4_ = fVar83 * local_530;
                      auVar177._4_4_ = fVar83 * fStack_52c;
                      auVar177._8_4_ = fVar83 * fStack_528;
                      auVar177._12_4_ = fVar83 * fStack_524;
                      auVar189._4_4_ = fVar159;
                      auVar189._0_4_ = fVar159;
                      auVar189._8_4_ = fVar159;
                      auVar189._12_4_ = fVar159;
                      auVar72._8_8_ = uStack_518;
                      auVar72._0_8_ = local_520;
                      auVar89 = vfmadd132ps_fma(auVar189,auVar177,auVar72);
                      auVar190 = ZEXT1664(auVar89);
                      auVar178._4_4_ = fVar148;
                      auVar178._0_4_ = fVar148;
                      auVar178._8_4_ = fVar148;
                      auVar178._12_4_ = fVar148;
                      auVar88 = vfmadd213ps_fma(auVar178,auVar201._0_16_,auVar89);
                      auVar166._4_4_ = fVar170;
                      auVar166._0_4_ = fVar170;
                      auVar166._8_4_ = fVar170;
                      auVar166._12_4_ = fVar170;
                      auVar88 = vfmadd213ps_fma(auVar166,auVar199._0_16_,auVar88);
                      local_4b0 = vmovlps_avx(auVar88);
                      local_4a8 = vextractps_avx(auVar88,2);
                      local_49c = (int)local_538;
                      local_498 = (int)local_550;
                      local_494 = (local_500.context)->instID[0];
                      local_490 = (local_500.context)->instPrimID[0];
                      local_554 = -1;
                      local_500.valid = &local_554;
                      local_500.geometryUserPtr = pGVar78->userPtr;
                      local_500.ray = (RTCRayN *)ray;
                      local_500.hit = (RTCHitN *)&local_4b0;
                      local_500.N = 1;
                      if (pGVar78->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01d216c4:
                        p_Var14 = context->args->filter;
                        if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar78->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar185 = ZEXT1664(auVar185._0_16_);
                          auVar190 = ZEXT1664(auVar190._0_16_);
                          auVar194 = ZEXT1664(auVar194._0_16_);
                          (*p_Var14)(&local_500);
                          auVar208 = ZEXT3264(local_460);
                          auVar212 = ZEXT3264(local_480);
                          auVar201 = ZEXT1664(local_4d0);
                          auVar199 = ZEXT1664(local_4c0);
                          context = local_540;
                          ray = local_548;
                          if (*local_500.valid == 0) goto LAB_01d21775;
                        }
                        (((Vec3f *)((long)local_500.ray + 0x30))->field_0).components[0] =
                             *(float *)local_500.hit;
                        (((Vec3f *)((long)local_500.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_500.hit + 4);
                        (((Vec3f *)((long)local_500.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_500.hit + 8);
                        *(float *)((long)local_500.ray + 0x3c) = *(float *)(local_500.hit + 0xc);
                        *(float *)((long)local_500.ray + 0x40) = *(float *)(local_500.hit + 0x10);
                        *(float *)((long)local_500.ray + 0x44) = *(float *)(local_500.hit + 0x14);
                        *(float *)((long)local_500.ray + 0x48) = *(float *)(local_500.hit + 0x18);
                        *(float *)((long)local_500.ray + 0x4c) = *(float *)(local_500.hit + 0x1c);
                        *(float *)((long)local_500.ray + 0x50) = *(float *)(local_500.hit + 0x20);
                      }
                      else {
                        auVar185 = ZEXT464((uint)fVar148);
                        auVar190 = ZEXT1664(auVar89);
                        auVar194 = ZEXT1664(auVar87);
                        (*pGVar78->intersectionFilterN)(&local_500);
                        auVar208 = ZEXT3264(local_460);
                        auVar212 = ZEXT3264(local_480);
                        auVar201 = ZEXT1664(local_4d0);
                        auVar199 = ZEXT1664(local_4c0);
                        context = local_540;
                        ray = local_548;
                        if (*local_500.valid != 0) goto LAB_01d216c4;
LAB_01d21775:
                        (local_548->super_RayK<1>).tfar = (float)local_400._0_4_;
                        context = local_540;
                        ray = local_548;
                      }
                      bVar82 = ~(byte)(1 << ((uint)uVar74 & 0x1f)) & (byte)uVar81;
                      fVar170 = (ray->super_RayK<1>).tfar;
                      auVar36._4_4_ = fVar170;
                      auVar36._0_4_ = fVar170;
                      auVar36._8_4_ = fVar170;
                      auVar36._12_4_ = fVar170;
                      auVar36._16_4_ = fVar170;
                      auVar36._20_4_ = fVar170;
                      auVar36._24_4_ = fVar170;
                      auVar36._28_4_ = fVar170;
                      uVar21 = vcmpps_avx512vl(auVar208._0_32_,auVar36,2);
                      pre = local_510;
                      prim = local_508;
                      if ((bVar82 & (byte)uVar21) == 0) goto LAB_01d20833;
                      local_400 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                      bVar82 = bVar82 & (byte)uVar21;
                      uVar81 = (ulong)bVar82;
                      auVar158._8_4_ = 0x7f800000;
                      auVar158._0_8_ = 0x7f8000007f800000;
                      auVar158._12_4_ = 0x7f800000;
                      auVar158._16_4_ = 0x7f800000;
                      auVar158._20_4_ = 0x7f800000;
                      auVar158._24_4_ = 0x7f800000;
                      auVar158._28_4_ = 0x7f800000;
                      auVar97 = vblendmps_avx512vl(auVar158,auVar208._0_32_);
                      auVar136._0_4_ =
                           (uint)(bVar82 & 1) * auVar97._0_4_ |
                           (uint)!(bool)(bVar82 & 1) * 0x7f800000;
                      bVar15 = (bool)(bVar82 >> 1 & 1);
                      auVar136._4_4_ = (uint)bVar15 * auVar97._4_4_ | (uint)!bVar15 * 0x7f800000;
                      bVar15 = (bool)(bVar82 >> 2 & 1);
                      auVar136._8_4_ = (uint)bVar15 * auVar97._8_4_ | (uint)!bVar15 * 0x7f800000;
                      bVar15 = (bool)(bVar82 >> 3 & 1);
                      auVar136._12_4_ = (uint)bVar15 * auVar97._12_4_ | (uint)!bVar15 * 0x7f800000;
                      bVar15 = (bool)(bVar82 >> 4 & 1);
                      auVar136._16_4_ = (uint)bVar15 * auVar97._16_4_ | (uint)!bVar15 * 0x7f800000;
                      bVar15 = (bool)(bVar82 >> 5 & 1);
                      auVar136._20_4_ = (uint)bVar15 * auVar97._20_4_ | (uint)!bVar15 * 0x7f800000;
                      bVar15 = (bool)(bVar82 >> 6 & 1);
                      auVar136._24_4_ = (uint)bVar15 * auVar97._24_4_ | (uint)!bVar15 * 0x7f800000;
                      auVar136._28_4_ =
                           (uint)(bVar82 >> 7) * auVar97._28_4_ |
                           (uint)!(bool)(bVar82 >> 7) * 0x7f800000;
                      auVar97 = vshufps_avx(auVar136,auVar136,0xb1);
                      auVar97 = vminps_avx(auVar136,auVar97);
                      auVar95 = vshufpd_avx(auVar97,auVar97,5);
                      auVar97 = vminps_avx(auVar97,auVar95);
                      auVar95 = vpermpd_avx2(auVar97,0x4e);
                      auVar97 = vminps_avx(auVar97,auVar95);
                      uVar21 = vcmpps_avx512vl(auVar136,auVar97,0);
                      bVar73 = (byte)uVar21 & bVar82;
                      if (bVar73 != 0) {
                        bVar82 = bVar73;
                      }
                      uVar79 = 0;
                      for (uVar76 = (uint)bVar82; (uVar76 & 1) == 0;
                          uVar76 = uVar76 >> 1 | 0x80000000) {
                        uVar79 = uVar79 + 1;
                      }
                      uVar74 = (ulong)uVar79;
                    } while( true );
                  }
                  fVar170 = local_200[uVar74];
                  fVar148 = *(float *)(local_1e0 + uVar74 * 4);
                  fVar159 = 1.0 - fVar170;
                  auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar170 * (fVar159 + fVar159))),
                                            ZEXT416((uint)fVar159),ZEXT416((uint)fVar159));
                  auVar87 = ZEXT416((uint)fVar170);
                  auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar87,
                                            ZEXT416(0xc0a00000));
                  auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar170 * fVar170 * 3.0)),
                                            ZEXT416((uint)(fVar170 + fVar170)),auVar89);
                  auVar194 = ZEXT1664(auVar88);
                  auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar87,
                                            ZEXT416(0x40000000));
                  auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar159 * fVar159 * -3.0)),
                                            ZEXT416((uint)(fVar159 + fVar159)),auVar89);
                  auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar170 * fVar170)),auVar87,
                                            ZEXT416((uint)(fVar159 * -2.0)));
                  fVar159 = auVar8._0_4_ * 0.5;
                  fVar83 = auVar88._0_4_ * 0.5;
                  fVar84 = auVar89._0_4_ * 0.5;
                  fVar137 = auVar87._0_4_ * 0.5;
                  auVar171._0_4_ = fVar137 * local_530;
                  auVar171._4_4_ = fVar137 * fStack_52c;
                  auVar171._8_4_ = fVar137 * fStack_528;
                  auVar171._12_4_ = fVar137 * fStack_524;
                  auVar186._4_4_ = fVar84;
                  auVar186._0_4_ = fVar84;
                  auVar186._8_4_ = fVar84;
                  auVar186._12_4_ = fVar84;
                  auVar89 = vfmadd132ps_fma(auVar186,auVar171,*pauVar3);
                  auVar190 = ZEXT1664(auVar89);
                  auVar172._4_4_ = fVar83;
                  auVar172._0_4_ = fVar83;
                  auVar172._8_4_ = fVar83;
                  auVar172._12_4_ = fVar83;
                  auVar89 = vfmadd213ps_fma(auVar172,local_4d0,auVar89);
                  auVar163._4_4_ = fVar159;
                  auVar163._0_4_ = fVar159;
                  auVar163._8_4_ = fVar159;
                  auVar163._12_4_ = fVar159;
                  auVar185 = ZEXT464((uint)*(float *)(local_1c0 + uVar74 * 4));
                  (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar74 * 4);
                  auVar89 = vfmadd213ps_fma(auVar163,local_4c0,auVar89);
                  uVar21 = vmovlps_avx(auVar89);
                  *(undefined8 *)&(ray->Ng).field_0 = uVar21;
                  fVar159 = (float)vextractps_avx(auVar89,2);
                  (ray->Ng).field_0.field_0.z = fVar159;
                  ray->u = fVar170;
                  ray->v = fVar148;
                  ray->primID = uVar76;
                  ray->geomID = uVar79;
                  ray->instID[0] = context->user->instID[0];
                  ray->instPrimID[0] = context->user->instPrimID[0];
                  pre = local_510;
                  prim = local_508;
                }
              }
            }
          }
        }
      }
LAB_01d20833:
      if (8 < iVar13) {
        auVar97 = vpbroadcastd_avx512vl();
        auVar208 = ZEXT3264(auVar97);
        local_400._4_4_ = local_420._0_4_;
        local_400._0_4_ = local_420._0_4_;
        local_400._8_4_ = local_420._0_4_;
        local_400._12_4_ = local_420._0_4_;
        local_400._16_4_ = local_420._0_4_;
        local_400._20_4_ = local_420._0_4_;
        local_400._24_4_ = local_420._0_4_;
        local_400._28_4_ = local_420._0_4_;
        auVar155._8_4_ = 3;
        auVar155._0_8_ = 0x300000003;
        auVar155._12_4_ = 3;
        auVar155._16_4_ = 3;
        auVar155._20_4_ = 3;
        auVar155._24_4_ = 3;
        auVar155._28_4_ = 3;
        local_3e0 = vpermps_avx2(auVar155,local_3e0);
        local_120 = 1.0 / (float)local_440._0_4_;
        fStack_11c = local_120;
        fStack_118 = local_120;
        fStack_114 = local_120;
        fStack_110 = local_120;
        fStack_10c = local_120;
        fStack_108 = local_120;
        fStack_104 = local_120;
        lVar77 = 8;
        local_480 = auVar212._0_32_;
LAB_01d208c2:
        auVar97 = vpbroadcastd_avx512vl();
        auVar97 = vpor_avx2(auVar97,_DAT_01fe9900);
        uVar23 = vpcmpgtd_avx512vl(auVar208._0_32_,auVar97);
        auVar97 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar77 * 4 + lVar25);
        auVar95 = *(undefined1 (*) [32])(lVar25 + 0x21b37f0 + lVar77 * 4);
        auVar111 = *(undefined1 (*) [32])(lVar25 + 0x21b3c74 + lVar77 * 4);
        auVar109 = *(undefined1 (*) [32])(lVar25 + 0x21b40f8 + lVar77 * 4);
        auVar199._0_4_ = auVar109._0_4_ * (float)local_3a0._0_4_;
        auVar199._4_4_ = auVar109._4_4_ * (float)local_3a0._4_4_;
        auVar199._8_4_ = auVar109._8_4_ * fStack_398;
        auVar199._12_4_ = auVar109._12_4_ * fStack_394;
        auVar199._16_4_ = auVar109._16_4_ * fStack_390;
        auVar199._20_4_ = auVar109._20_4_ * fStack_38c;
        auVar199._28_36_ = auVar190._28_36_;
        auVar199._24_4_ = auVar109._24_4_ * fStack_388;
        auVar190._0_4_ = auVar109._0_4_ * (float)local_3c0._0_4_;
        auVar190._4_4_ = auVar109._4_4_ * (float)local_3c0._4_4_;
        auVar190._8_4_ = auVar109._8_4_ * fStack_3b8;
        auVar190._12_4_ = auVar109._12_4_ * fStack_3b4;
        auVar190._16_4_ = auVar109._16_4_ * fStack_3b0;
        auVar190._20_4_ = auVar109._20_4_ * fStack_3ac;
        auVar190._28_36_ = auVar185._28_36_;
        auVar190._24_4_ = auVar109._24_4_ * fStack_3a8;
        auVar102 = auVar212._0_32_;
        auVar107 = vmulps_avx512vl(local_100,auVar109);
        auVar96 = vfmadd231ps_avx512vl(auVar199._0_32_,auVar111,local_360);
        auVar98 = vfmadd231ps_avx512vl(auVar190._0_32_,auVar111,local_380);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar111,local_e0);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar95,local_320);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar95,local_340);
        auVar108 = vfmadd231ps_avx512vl(auVar107,auVar95,local_c0);
        auVar89 = vfmadd231ps_fma(auVar96,auVar97,local_2e0);
        auVar190 = ZEXT1664(auVar89);
        auVar88 = vfmadd231ps_fma(auVar98,auVar97,local_300);
        auVar185 = ZEXT1664(auVar88);
        auVar107 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar77 * 4 + lVar25);
        auVar96 = *(undefined1 (*) [32])(lVar25 + 0x21b5c10 + lVar77 * 4);
        auVar94 = vfmadd231ps_avx512vl(auVar108,auVar97,local_a0);
        auVar98 = *(undefined1 (*) [32])(lVar25 + 0x21b6094 + lVar77 * 4);
        auVar108 = *(undefined1 (*) [32])(lVar25 + 0x21b6518 + lVar77 * 4);
        auVar201._0_4_ = auVar108._0_4_ * (float)local_3a0._0_4_;
        auVar201._4_4_ = auVar108._4_4_ * (float)local_3a0._4_4_;
        auVar201._8_4_ = auVar108._8_4_ * fStack_398;
        auVar201._12_4_ = auVar108._12_4_ * fStack_394;
        auVar201._16_4_ = auVar108._16_4_ * fStack_390;
        auVar201._20_4_ = auVar108._20_4_ * fStack_38c;
        auVar201._28_36_ = auVar194._28_36_;
        auVar201._24_4_ = auVar108._24_4_ * fStack_388;
        auVar53._4_4_ = auVar108._4_4_ * (float)local_3c0._4_4_;
        auVar53._0_4_ = auVar108._0_4_ * (float)local_3c0._0_4_;
        auVar53._8_4_ = auVar108._8_4_ * fStack_3b8;
        auVar53._12_4_ = auVar108._12_4_ * fStack_3b4;
        auVar53._16_4_ = auVar108._16_4_ * fStack_3b0;
        auVar53._20_4_ = auVar108._20_4_ * fStack_3ac;
        auVar53._24_4_ = auVar108._24_4_ * fStack_3a8;
        auVar53._28_4_ = uStack_3a4;
        auVar110 = vmulps_avx512vl(local_100,auVar108);
        auVar212 = ZEXT3264(auVar102);
        auVar99 = vfmadd231ps_avx512vl(auVar201._0_32_,auVar98,local_360);
        auVar100 = vfmadd231ps_avx512vl(auVar53,auVar98,local_380);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar98,local_e0);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar96,local_320);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar96,local_340);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar96,local_c0);
        auVar87 = vfmadd231ps_fma(auVar99,auVar107,local_2e0);
        auVar194 = ZEXT1664(auVar87);
        auVar8 = vfmadd231ps_fma(auVar100,auVar107,local_300);
        auVar100 = vfmadd231ps_avx512vl(auVar110,auVar107,local_a0);
        auVar101 = vmaxps_avx512vl(auVar94,auVar100);
        auVar110 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar89));
        auVar99 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar88));
        auVar92 = vmulps_avx512vl(ZEXT1632(auVar88),auVar110);
        auVar93 = vmulps_avx512vl(ZEXT1632(auVar89),auVar99);
        auVar92 = vsubps_avx512vl(auVar92,auVar93);
        auVar93 = vmulps_avx512vl(auVar99,auVar99);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar110,auVar110);
        auVar101 = vmulps_avx512vl(auVar101,auVar101);
        auVar101 = vmulps_avx512vl(auVar101,auVar93);
        auVar92 = vmulps_avx512vl(auVar92,auVar92);
        uVar21 = vcmpps_avx512vl(auVar92,auVar101,2);
        bVar82 = (byte)uVar23 & (byte)uVar21;
        if (bVar82 != 0) {
          auVar108 = vmulps_avx512vl(local_1a0,auVar108);
          auVar98 = vfmadd213ps_avx512vl(auVar98,local_180,auVar108);
          auVar96 = vfmadd213ps_avx512vl(auVar96,local_160,auVar98);
          auVar107 = vfmadd213ps_avx512vl(auVar107,auVar102,auVar96);
          auVar109 = vmulps_avx512vl(local_1a0,auVar109);
          auVar111 = vfmadd213ps_avx512vl(auVar111,local_180,auVar109);
          auVar95 = vfmadd213ps_avx512vl(auVar95,local_160,auVar111);
          auVar96 = vfmadd213ps_avx512vl(auVar97,auVar102,auVar95);
          auVar97 = *(undefined1 (*) [32])(lVar25 + 0x21b457c + lVar77 * 4);
          auVar95 = *(undefined1 (*) [32])(lVar25 + 0x21b4a00 + lVar77 * 4);
          auVar111 = *(undefined1 (*) [32])(lVar25 + 0x21b4e84 + lVar77 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar25 + 0x21b5308 + lVar77 * 4);
          auVar98 = vmulps_avx512vl(_local_3a0,auVar109);
          auVar108 = vmulps_avx512vl(_local_3c0,auVar109);
          auVar109 = vmulps_avx512vl(local_1a0,auVar109);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar111,local_360);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar111,local_380);
          auVar111 = vfmadd231ps_avx512vl(auVar109,local_180,auVar111);
          auVar109 = vfmadd231ps_avx512vl(auVar98,auVar95,local_320);
          auVar98 = vfmadd231ps_avx512vl(auVar108,auVar95,local_340);
          auVar95 = vfmadd231ps_avx512vl(auVar111,local_160,auVar95);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar97,local_2e0);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar97,local_300);
          auVar85 = vfmadd231ps_fma(auVar95,auVar97,local_480);
          auVar97 = *(undefined1 (*) [32])(lVar25 + 0x21b699c + lVar77 * 4);
          auVar95 = *(undefined1 (*) [32])(lVar25 + 0x21b72a4 + lVar77 * 4);
          auVar111 = *(undefined1 (*) [32])(lVar25 + 0x21b7728 + lVar77 * 4);
          auVar108 = vmulps_avx512vl(_local_3a0,auVar111);
          auVar101 = vmulps_avx512vl(_local_3c0,auVar111);
          auVar111 = vmulps_avx512vl(local_1a0,auVar111);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar95,local_360);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar95,local_380);
          auVar111 = vfmadd231ps_avx512vl(auVar111,local_180,auVar95);
          auVar95 = *(undefined1 (*) [32])(lVar25 + 0x21b6e20 + lVar77 * 4);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar95,local_320);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar95,local_340);
          auVar212 = ZEXT3264(local_480);
          auVar95 = vfmadd231ps_avx512vl(auVar111,local_160,auVar95);
          auVar111 = vfmadd231ps_avx512vl(auVar108,auVar97,local_2e0);
          auVar108 = vfmadd231ps_avx512vl(auVar101,auVar97,local_300);
          auVar95 = vfmadd231ps_avx512vl(auVar95,local_480,auVar97);
          auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar109,auVar101);
          vandps_avx512vl(auVar98,auVar101);
          auVar97 = vmaxps_avx(auVar101,auVar101);
          vandps_avx512vl(ZEXT1632(auVar85),auVar101);
          auVar97 = vmaxps_avx(auVar97,auVar101);
          uVar74 = vcmpps_avx512vl(auVar97,local_400,1);
          bVar15 = (bool)((byte)uVar74 & 1);
          auVar124._0_4_ = (float)((uint)bVar15 * auVar110._0_4_ | (uint)!bVar15 * auVar109._0_4_);
          bVar15 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar124._4_4_ = (float)((uint)bVar15 * auVar110._4_4_ | (uint)!bVar15 * auVar109._4_4_);
          bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar124._8_4_ = (float)((uint)bVar15 * auVar110._8_4_ | (uint)!bVar15 * auVar109._8_4_);
          bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar124._12_4_ =
               (float)((uint)bVar15 * auVar110._12_4_ | (uint)!bVar15 * auVar109._12_4_);
          bVar15 = (bool)((byte)(uVar74 >> 4) & 1);
          auVar124._16_4_ =
               (float)((uint)bVar15 * auVar110._16_4_ | (uint)!bVar15 * auVar109._16_4_);
          bVar15 = (bool)((byte)(uVar74 >> 5) & 1);
          auVar124._20_4_ =
               (float)((uint)bVar15 * auVar110._20_4_ | (uint)!bVar15 * auVar109._20_4_);
          bVar15 = (bool)((byte)(uVar74 >> 6) & 1);
          auVar124._24_4_ =
               (float)((uint)bVar15 * auVar110._24_4_ | (uint)!bVar15 * auVar109._24_4_);
          bVar15 = SUB81(uVar74 >> 7,0);
          auVar124._28_4_ = (uint)bVar15 * auVar110._28_4_ | (uint)!bVar15 * auVar109._28_4_;
          bVar15 = (bool)((byte)uVar74 & 1);
          auVar125._0_4_ = (float)((uint)bVar15 * auVar99._0_4_ | (uint)!bVar15 * auVar98._0_4_);
          bVar15 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar15 * auVar99._4_4_ | (uint)!bVar15 * auVar98._4_4_);
          bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar15 * auVar99._8_4_ | (uint)!bVar15 * auVar98._8_4_);
          bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar125._12_4_ = (float)((uint)bVar15 * auVar99._12_4_ | (uint)!bVar15 * auVar98._12_4_);
          bVar15 = (bool)((byte)(uVar74 >> 4) & 1);
          auVar125._16_4_ = (float)((uint)bVar15 * auVar99._16_4_ | (uint)!bVar15 * auVar98._16_4_);
          bVar15 = (bool)((byte)(uVar74 >> 5) & 1);
          auVar125._20_4_ = (float)((uint)bVar15 * auVar99._20_4_ | (uint)!bVar15 * auVar98._20_4_);
          bVar15 = (bool)((byte)(uVar74 >> 6) & 1);
          auVar125._24_4_ = (float)((uint)bVar15 * auVar99._24_4_ | (uint)!bVar15 * auVar98._24_4_);
          bVar15 = SUB81(uVar74 >> 7,0);
          auVar125._28_4_ = (uint)bVar15 * auVar99._28_4_ | (uint)!bVar15 * auVar98._28_4_;
          vandps_avx512vl(auVar111,auVar101);
          vandps_avx512vl(auVar108,auVar101);
          auVar97 = vmaxps_avx(auVar125,auVar125);
          vandps_avx512vl(auVar95,auVar101);
          auVar97 = vmaxps_avx(auVar97,auVar125);
          uVar74 = vcmpps_avx512vl(auVar97,local_400,1);
          bVar15 = (bool)((byte)uVar74 & 1);
          auVar126._0_4_ = (uint)bVar15 * auVar110._0_4_ | (uint)!bVar15 * auVar111._0_4_;
          bVar15 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar126._4_4_ = (uint)bVar15 * auVar110._4_4_ | (uint)!bVar15 * auVar111._4_4_;
          bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar126._8_4_ = (uint)bVar15 * auVar110._8_4_ | (uint)!bVar15 * auVar111._8_4_;
          bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar126._12_4_ = (uint)bVar15 * auVar110._12_4_ | (uint)!bVar15 * auVar111._12_4_;
          bVar15 = (bool)((byte)(uVar74 >> 4) & 1);
          auVar126._16_4_ = (uint)bVar15 * auVar110._16_4_ | (uint)!bVar15 * auVar111._16_4_;
          bVar15 = (bool)((byte)(uVar74 >> 5) & 1);
          auVar126._20_4_ = (uint)bVar15 * auVar110._20_4_ | (uint)!bVar15 * auVar111._20_4_;
          bVar15 = (bool)((byte)(uVar74 >> 6) & 1);
          auVar126._24_4_ = (uint)bVar15 * auVar110._24_4_ | (uint)!bVar15 * auVar111._24_4_;
          bVar15 = SUB81(uVar74 >> 7,0);
          auVar126._28_4_ = (uint)bVar15 * auVar110._28_4_ | (uint)!bVar15 * auVar111._28_4_;
          bVar15 = (bool)((byte)uVar74 & 1);
          auVar127._0_4_ = (float)((uint)bVar15 * auVar99._0_4_ | (uint)!bVar15 * auVar108._0_4_);
          bVar15 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar127._4_4_ = (float)((uint)bVar15 * auVar99._4_4_ | (uint)!bVar15 * auVar108._4_4_);
          bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar127._8_4_ = (float)((uint)bVar15 * auVar99._8_4_ | (uint)!bVar15 * auVar108._8_4_);
          bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar127._12_4_ = (float)((uint)bVar15 * auVar99._12_4_ | (uint)!bVar15 * auVar108._12_4_)
          ;
          bVar15 = (bool)((byte)(uVar74 >> 4) & 1);
          auVar127._16_4_ = (float)((uint)bVar15 * auVar99._16_4_ | (uint)!bVar15 * auVar108._16_4_)
          ;
          bVar15 = (bool)((byte)(uVar74 >> 5) & 1);
          auVar127._20_4_ = (float)((uint)bVar15 * auVar99._20_4_ | (uint)!bVar15 * auVar108._20_4_)
          ;
          bVar15 = (bool)((byte)(uVar74 >> 6) & 1);
          auVar127._24_4_ = (float)((uint)bVar15 * auVar99._24_4_ | (uint)!bVar15 * auVar108._24_4_)
          ;
          bVar15 = SUB81(uVar74 >> 7,0);
          auVar127._28_4_ = (uint)bVar15 * auVar99._28_4_ | (uint)!bVar15 * auVar108._28_4_;
          auVar198._8_4_ = 0x80000000;
          auVar198._0_8_ = 0x8000000080000000;
          auVar198._12_4_ = 0x80000000;
          auVar198._16_4_ = 0x80000000;
          auVar198._20_4_ = 0x80000000;
          auVar198._24_4_ = 0x80000000;
          auVar198._28_4_ = 0x80000000;
          auVar97 = vxorps_avx512vl(auVar126,auVar198);
          auVar91 = vxorps_avx512vl(auVar101._0_16_,auVar101._0_16_);
          auVar95 = vfmadd213ps_avx512vl(auVar124,auVar124,ZEXT1632(auVar91));
          auVar85 = vfmadd231ps_fma(auVar95,auVar125,auVar125);
          auVar95 = vrsqrt14ps_avx512vl(ZEXT1632(auVar85));
          auVar211._8_4_ = 0xbf000000;
          auVar211._0_8_ = 0xbf000000bf000000;
          auVar211._12_4_ = 0xbf000000;
          auVar211._16_4_ = 0xbf000000;
          auVar211._20_4_ = 0xbf000000;
          auVar211._24_4_ = 0xbf000000;
          auVar211._28_4_ = 0xbf000000;
          fVar170 = auVar95._0_4_;
          fVar148 = auVar95._4_4_;
          fVar159 = auVar95._8_4_;
          fVar83 = auVar95._12_4_;
          fVar84 = auVar95._16_4_;
          fVar137 = auVar95._20_4_;
          fVar138 = auVar95._24_4_;
          auVar54._4_4_ = fVar148 * fVar148 * fVar148 * auVar85._4_4_ * -0.5;
          auVar54._0_4_ = fVar170 * fVar170 * fVar170 * auVar85._0_4_ * -0.5;
          auVar54._8_4_ = fVar159 * fVar159 * fVar159 * auVar85._8_4_ * -0.5;
          auVar54._12_4_ = fVar83 * fVar83 * fVar83 * auVar85._12_4_ * -0.5;
          auVar54._16_4_ = fVar84 * fVar84 * fVar84 * -0.0;
          auVar54._20_4_ = fVar137 * fVar137 * fVar137 * -0.0;
          auVar54._24_4_ = fVar138 * fVar138 * fVar138 * -0.0;
          auVar54._28_4_ = auVar125._28_4_;
          auVar111 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar95 = vfmadd231ps_avx512vl(auVar54,auVar111,auVar95);
          auVar55._4_4_ = auVar125._4_4_ * auVar95._4_4_;
          auVar55._0_4_ = auVar125._0_4_ * auVar95._0_4_;
          auVar55._8_4_ = auVar125._8_4_ * auVar95._8_4_;
          auVar55._12_4_ = auVar125._12_4_ * auVar95._12_4_;
          auVar55._16_4_ = auVar125._16_4_ * auVar95._16_4_;
          auVar55._20_4_ = auVar125._20_4_ * auVar95._20_4_;
          auVar55._24_4_ = auVar125._24_4_ * auVar95._24_4_;
          auVar55._28_4_ = 0;
          auVar56._4_4_ = auVar95._4_4_ * -auVar124._4_4_;
          auVar56._0_4_ = auVar95._0_4_ * -auVar124._0_4_;
          auVar56._8_4_ = auVar95._8_4_ * -auVar124._8_4_;
          auVar56._12_4_ = auVar95._12_4_ * -auVar124._12_4_;
          auVar56._16_4_ = auVar95._16_4_ * -auVar124._16_4_;
          auVar56._20_4_ = auVar95._20_4_ * -auVar124._20_4_;
          auVar56._24_4_ = auVar95._24_4_ * -auVar124._24_4_;
          auVar56._28_4_ = auVar125._28_4_;
          auVar109 = vmulps_avx512vl(auVar95,ZEXT1632(auVar91));
          auVar108 = ZEXT1632(auVar91);
          auVar95 = vfmadd213ps_avx512vl(auVar126,auVar126,auVar108);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar127,auVar127);
          auVar98 = vrsqrt14ps_avx512vl(auVar95);
          auVar95 = vmulps_avx512vl(auVar95,auVar211);
          fVar170 = auVar98._0_4_;
          fVar148 = auVar98._4_4_;
          fVar159 = auVar98._8_4_;
          fVar83 = auVar98._12_4_;
          fVar84 = auVar98._16_4_;
          fVar137 = auVar98._20_4_;
          fVar138 = auVar98._24_4_;
          auVar57._4_4_ = fVar148 * fVar148 * fVar148 * auVar95._4_4_;
          auVar57._0_4_ = fVar170 * fVar170 * fVar170 * auVar95._0_4_;
          auVar57._8_4_ = fVar159 * fVar159 * fVar159 * auVar95._8_4_;
          auVar57._12_4_ = fVar83 * fVar83 * fVar83 * auVar95._12_4_;
          auVar57._16_4_ = fVar84 * fVar84 * fVar84 * auVar95._16_4_;
          auVar57._20_4_ = fVar137 * fVar137 * fVar137 * auVar95._20_4_;
          auVar57._24_4_ = fVar138 * fVar138 * fVar138 * auVar95._24_4_;
          auVar57._28_4_ = auVar95._28_4_;
          auVar95 = vfmadd231ps_avx512vl(auVar57,auVar111,auVar98);
          auVar58._4_4_ = auVar127._4_4_ * auVar95._4_4_;
          auVar58._0_4_ = auVar127._0_4_ * auVar95._0_4_;
          auVar58._8_4_ = auVar127._8_4_ * auVar95._8_4_;
          auVar58._12_4_ = auVar127._12_4_ * auVar95._12_4_;
          auVar58._16_4_ = auVar127._16_4_ * auVar95._16_4_;
          auVar58._20_4_ = auVar127._20_4_ * auVar95._20_4_;
          auVar58._24_4_ = auVar127._24_4_ * auVar95._24_4_;
          auVar58._28_4_ = auVar98._28_4_;
          auVar59._4_4_ = auVar95._4_4_ * auVar97._4_4_;
          auVar59._0_4_ = auVar95._0_4_ * auVar97._0_4_;
          auVar59._8_4_ = auVar95._8_4_ * auVar97._8_4_;
          auVar59._12_4_ = auVar95._12_4_ * auVar97._12_4_;
          auVar59._16_4_ = auVar95._16_4_ * auVar97._16_4_;
          auVar59._20_4_ = auVar95._20_4_ * auVar97._20_4_;
          auVar59._24_4_ = auVar95._24_4_ * auVar97._24_4_;
          auVar59._28_4_ = auVar97._28_4_;
          auVar97 = vmulps_avx512vl(auVar95,auVar108);
          auVar85 = vfmadd213ps_fma(auVar55,auVar94,ZEXT1632(auVar89));
          auVar9 = vfmadd213ps_fma(auVar56,auVar94,ZEXT1632(auVar88));
          auVar111 = vfmadd213ps_avx512vl(auVar109,auVar94,auVar96);
          auVar98 = vfmadd213ps_avx512vl(auVar58,auVar100,ZEXT1632(auVar87));
          auVar11 = vfnmadd213ps_fma(auVar55,auVar94,ZEXT1632(auVar89));
          auVar89 = vfmadd213ps_fma(auVar59,auVar100,ZEXT1632(auVar8));
          auVar86 = vfnmadd213ps_fma(auVar56,auVar94,ZEXT1632(auVar88));
          auVar88 = vfmadd213ps_fma(auVar97,auVar100,auVar107);
          auVar162 = vfnmadd231ps_fma(auVar96,auVar94,auVar109);
          auVar90 = vfnmadd213ps_fma(auVar58,auVar100,ZEXT1632(auVar87));
          auVar160 = vfnmadd213ps_fma(auVar59,auVar100,ZEXT1632(auVar8));
          auVar191 = vfnmadd231ps_fma(auVar107,auVar100,auVar97);
          auVar107 = vsubps_avx512vl(auVar98,ZEXT1632(auVar11));
          auVar97 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar86));
          auVar95 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar162));
          auVar60._4_4_ = auVar97._4_4_ * auVar162._4_4_;
          auVar60._0_4_ = auVar97._0_4_ * auVar162._0_4_;
          auVar60._8_4_ = auVar97._8_4_ * auVar162._8_4_;
          auVar60._12_4_ = auVar97._12_4_ * auVar162._12_4_;
          auVar60._16_4_ = auVar97._16_4_ * 0.0;
          auVar60._20_4_ = auVar97._20_4_ * 0.0;
          auVar60._24_4_ = auVar97._24_4_ * 0.0;
          auVar60._28_4_ = auVar109._28_4_;
          auVar87 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar86),auVar95);
          auVar61._4_4_ = auVar95._4_4_ * auVar11._4_4_;
          auVar61._0_4_ = auVar95._0_4_ * auVar11._0_4_;
          auVar61._8_4_ = auVar95._8_4_ * auVar11._8_4_;
          auVar61._12_4_ = auVar95._12_4_ * auVar11._12_4_;
          auVar61._16_4_ = auVar95._16_4_ * 0.0;
          auVar61._20_4_ = auVar95._20_4_ * 0.0;
          auVar61._24_4_ = auVar95._24_4_ * 0.0;
          auVar61._28_4_ = auVar95._28_4_;
          auVar8 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar162),auVar107);
          auVar62._4_4_ = auVar86._4_4_ * auVar107._4_4_;
          auVar62._0_4_ = auVar86._0_4_ * auVar107._0_4_;
          auVar62._8_4_ = auVar86._8_4_ * auVar107._8_4_;
          auVar62._12_4_ = auVar86._12_4_ * auVar107._12_4_;
          auVar62._16_4_ = auVar107._16_4_ * 0.0;
          auVar62._20_4_ = auVar107._20_4_ * 0.0;
          auVar62._24_4_ = auVar107._24_4_ * 0.0;
          auVar62._28_4_ = auVar107._28_4_;
          auVar10 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar11),auVar97);
          auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar108,ZEXT1632(auVar8));
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar108,ZEXT1632(auVar87));
          auVar92 = ZEXT1632(auVar91);
          uVar74 = vcmpps_avx512vl(auVar97,auVar92,2);
          bVar73 = (byte)uVar74;
          fVar144 = (float)((uint)(bVar73 & 1) * auVar85._0_4_ |
                           (uint)!(bool)(bVar73 & 1) * auVar90._0_4_);
          bVar15 = (bool)((byte)(uVar74 >> 1) & 1);
          fVar139 = (float)((uint)bVar15 * auVar85._4_4_ | (uint)!bVar15 * auVar90._4_4_);
          bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
          fVar142 = (float)((uint)bVar15 * auVar85._8_4_ | (uint)!bVar15 * auVar90._8_4_);
          bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
          fVar146 = (float)((uint)bVar15 * auVar85._12_4_ | (uint)!bVar15 * auVar90._12_4_);
          auVar108 = ZEXT1632(CONCAT412(fVar146,CONCAT48(fVar142,CONCAT44(fVar139,fVar144))));
          fVar145 = (float)((uint)(bVar73 & 1) * auVar9._0_4_ |
                           (uint)!(bool)(bVar73 & 1) * auVar160._0_4_);
          bVar15 = (bool)((byte)(uVar74 >> 1) & 1);
          fVar140 = (float)((uint)bVar15 * auVar9._4_4_ | (uint)!bVar15 * auVar160._4_4_);
          bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
          fVar143 = (float)((uint)bVar15 * auVar9._8_4_ | (uint)!bVar15 * auVar160._8_4_);
          bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
          fVar147 = (float)((uint)bVar15 * auVar9._12_4_ | (uint)!bVar15 * auVar160._12_4_);
          auVar110 = ZEXT1632(CONCAT412(fVar147,CONCAT48(fVar143,CONCAT44(fVar140,fVar145))));
          auVar128._0_4_ =
               (float)((uint)(bVar73 & 1) * auVar111._0_4_ |
                      (uint)!(bool)(bVar73 & 1) * auVar191._0_4_);
          bVar15 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar128._4_4_ = (float)((uint)bVar15 * auVar111._4_4_ | (uint)!bVar15 * auVar191._4_4_);
          bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar128._8_4_ = (float)((uint)bVar15 * auVar111._8_4_ | (uint)!bVar15 * auVar191._8_4_);
          bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar128._12_4_ =
               (float)((uint)bVar15 * auVar111._12_4_ | (uint)!bVar15 * auVar191._12_4_);
          fVar159 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar111._16_4_);
          auVar128._16_4_ = fVar159;
          fVar170 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar111._20_4_);
          auVar128._20_4_ = fVar170;
          fVar148 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar111._24_4_);
          auVar128._24_4_ = fVar148;
          iVar1 = (uint)(byte)(uVar74 >> 7) * auVar111._28_4_;
          auVar128._28_4_ = iVar1;
          auVar97 = vblendmps_avx512vl(ZEXT1632(auVar11),auVar98);
          auVar129._0_4_ =
               (uint)(bVar73 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar87._0_4_;
          bVar15 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar129._4_4_ = (uint)bVar15 * auVar97._4_4_ | (uint)!bVar15 * auVar87._4_4_;
          bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar129._8_4_ = (uint)bVar15 * auVar97._8_4_ | (uint)!bVar15 * auVar87._8_4_;
          bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar129._12_4_ = (uint)bVar15 * auVar97._12_4_ | (uint)!bVar15 * auVar87._12_4_;
          auVar129._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * auVar97._16_4_;
          auVar129._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * auVar97._20_4_;
          auVar129._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * auVar97._24_4_;
          auVar129._28_4_ = (uint)(byte)(uVar74 >> 7) * auVar97._28_4_;
          auVar97 = vblendmps_avx512vl(ZEXT1632(auVar86),ZEXT1632(auVar89));
          auVar130._0_4_ =
               (float)((uint)(bVar73 & 1) * auVar97._0_4_ |
                      (uint)!(bool)(bVar73 & 1) * auVar85._0_4_);
          bVar15 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar130._4_4_ = (float)((uint)bVar15 * auVar97._4_4_ | (uint)!bVar15 * auVar85._4_4_);
          bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar130._8_4_ = (float)((uint)bVar15 * auVar97._8_4_ | (uint)!bVar15 * auVar85._8_4_);
          bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar130._12_4_ = (float)((uint)bVar15 * auVar97._12_4_ | (uint)!bVar15 * auVar85._12_4_);
          fVar137 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar97._16_4_);
          auVar130._16_4_ = fVar137;
          fVar84 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar97._20_4_);
          auVar130._20_4_ = fVar84;
          fVar83 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar97._24_4_);
          auVar130._24_4_ = fVar83;
          auVar130._28_4_ = (uint)(byte)(uVar74 >> 7) * auVar97._28_4_;
          auVar97 = vblendmps_avx512vl(ZEXT1632(auVar162),ZEXT1632(auVar88));
          auVar131._0_4_ =
               (float)((uint)(bVar73 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar9._0_4_
                      );
          bVar15 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar131._4_4_ = (float)((uint)bVar15 * auVar97._4_4_ | (uint)!bVar15 * auVar9._4_4_);
          bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar131._8_4_ = (float)((uint)bVar15 * auVar97._8_4_ | (uint)!bVar15 * auVar9._8_4_);
          bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar131._12_4_ = (float)((uint)bVar15 * auVar97._12_4_ | (uint)!bVar15 * auVar9._12_4_);
          fVar141 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar97._16_4_);
          auVar131._16_4_ = fVar141;
          fVar169 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar97._20_4_);
          auVar131._20_4_ = fVar169;
          fVar138 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar97._24_4_);
          auVar131._24_4_ = fVar138;
          iVar2 = (uint)(byte)(uVar74 >> 7) * auVar97._28_4_;
          auVar131._28_4_ = iVar2;
          auVar132._0_4_ =
               (uint)(bVar73 & 1) * (int)auVar11._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar98._0_4_;
          bVar15 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar132._4_4_ = (uint)bVar15 * (int)auVar11._4_4_ | (uint)!bVar15 * auVar98._4_4_;
          bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar132._8_4_ = (uint)bVar15 * (int)auVar11._8_4_ | (uint)!bVar15 * auVar98._8_4_;
          bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar132._12_4_ = (uint)bVar15 * (int)auVar11._12_4_ | (uint)!bVar15 * auVar98._12_4_;
          auVar132._16_4_ = (uint)!(bool)((byte)(uVar74 >> 4) & 1) * auVar98._16_4_;
          auVar132._20_4_ = (uint)!(bool)((byte)(uVar74 >> 5) & 1) * auVar98._20_4_;
          auVar132._24_4_ = (uint)!(bool)((byte)(uVar74 >> 6) & 1) * auVar98._24_4_;
          auVar132._28_4_ = (uint)!SUB81(uVar74 >> 7,0) * auVar98._28_4_;
          bVar15 = (bool)((byte)(uVar74 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar74 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar74 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar74 >> 1) & 1);
          bVar18 = (bool)((byte)(uVar74 >> 2) & 1);
          bVar20 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar98 = vsubps_avx512vl(auVar132,auVar108);
          auVar95 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar86._12_4_ |
                                                  (uint)!bVar19 * auVar89._12_4_,
                                                  CONCAT48((uint)bVar17 * (int)auVar86._8_4_ |
                                                           (uint)!bVar17 * auVar89._8_4_,
                                                           CONCAT44((uint)bVar15 *
                                                                    (int)auVar86._4_4_ |
                                                                    (uint)!bVar15 * auVar89._4_4_,
                                                                    (uint)(bVar73 & 1) *
                                                                    (int)auVar86._0_4_ |
                                                                    (uint)!(bool)(bVar73 & 1) *
                                                                    auVar89._0_4_)))),auVar110);
          auVar190 = ZEXT3264(auVar95);
          auVar111 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar162._12_4_ |
                                                   (uint)!bVar20 * auVar88._12_4_,
                                                   CONCAT48((uint)bVar18 * (int)auVar162._8_4_ |
                                                            (uint)!bVar18 * auVar88._8_4_,
                                                            CONCAT44((uint)bVar16 *
                                                                     (int)auVar162._4_4_ |
                                                                     (uint)!bVar16 * auVar88._4_4_,
                                                                     (uint)(bVar73 & 1) *
                                                                     (int)auVar162._0_4_ |
                                                                     (uint)!(bool)(bVar73 & 1) *
                                                                     auVar88._0_4_)))),auVar128);
          auVar109 = vsubps_avx(auVar108,auVar129);
          auVar194 = ZEXT3264(auVar109);
          auVar107 = vsubps_avx(auVar110,auVar130);
          auVar96 = vsubps_avx(auVar128,auVar131);
          auVar63._4_4_ = auVar111._4_4_ * fVar139;
          auVar63._0_4_ = auVar111._0_4_ * fVar144;
          auVar63._8_4_ = auVar111._8_4_ * fVar142;
          auVar63._12_4_ = auVar111._12_4_ * fVar146;
          auVar63._16_4_ = auVar111._16_4_ * 0.0;
          auVar63._20_4_ = auVar111._20_4_ * 0.0;
          auVar63._24_4_ = auVar111._24_4_ * 0.0;
          auVar63._28_4_ = 0;
          auVar89 = vfmsub231ps_fma(auVar63,auVar128,auVar98);
          auVar179._0_4_ = fVar145 * auVar98._0_4_;
          auVar179._4_4_ = fVar140 * auVar98._4_4_;
          auVar179._8_4_ = fVar143 * auVar98._8_4_;
          auVar179._12_4_ = fVar147 * auVar98._12_4_;
          auVar179._16_4_ = auVar98._16_4_ * 0.0;
          auVar179._20_4_ = auVar98._20_4_ * 0.0;
          auVar179._24_4_ = auVar98._24_4_ * 0.0;
          auVar179._28_4_ = 0;
          auVar88 = vfmsub231ps_fma(auVar179,auVar108,auVar95);
          auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar92,ZEXT1632(auVar89));
          auVar182._0_4_ = auVar95._0_4_ * auVar128._0_4_;
          auVar182._4_4_ = auVar95._4_4_ * auVar128._4_4_;
          auVar182._8_4_ = auVar95._8_4_ * auVar128._8_4_;
          auVar182._12_4_ = auVar95._12_4_ * auVar128._12_4_;
          auVar182._16_4_ = auVar95._16_4_ * fVar159;
          auVar182._20_4_ = auVar95._20_4_ * fVar170;
          auVar182._24_4_ = auVar95._24_4_ * fVar148;
          auVar182._28_4_ = 0;
          auVar89 = vfmsub231ps_fma(auVar182,auVar110,auVar111);
          auVar99 = vfmadd231ps_avx512vl(auVar97,auVar92,ZEXT1632(auVar89));
          auVar97 = vmulps_avx512vl(auVar96,auVar129);
          auVar97 = vfmsub231ps_avx512vl(auVar97,auVar109,auVar131);
          auVar64._4_4_ = auVar107._4_4_ * auVar131._4_4_;
          auVar64._0_4_ = auVar107._0_4_ * auVar131._0_4_;
          auVar64._8_4_ = auVar107._8_4_ * auVar131._8_4_;
          auVar64._12_4_ = auVar107._12_4_ * auVar131._12_4_;
          auVar64._16_4_ = auVar107._16_4_ * fVar141;
          auVar64._20_4_ = auVar107._20_4_ * fVar169;
          auVar64._24_4_ = auVar107._24_4_ * fVar138;
          auVar64._28_4_ = iVar2;
          auVar89 = vfmsub231ps_fma(auVar64,auVar130,auVar96);
          auVar183._0_4_ = auVar130._0_4_ * auVar109._0_4_;
          auVar183._4_4_ = auVar130._4_4_ * auVar109._4_4_;
          auVar183._8_4_ = auVar130._8_4_ * auVar109._8_4_;
          auVar183._12_4_ = auVar130._12_4_ * auVar109._12_4_;
          auVar183._16_4_ = fVar137 * auVar109._16_4_;
          auVar183._20_4_ = fVar84 * auVar109._20_4_;
          auVar183._24_4_ = fVar83 * auVar109._24_4_;
          auVar183._28_4_ = 0;
          auVar88 = vfmsub231ps_fma(auVar183,auVar107,auVar129);
          auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar92,auVar97);
          auVar101 = vfmadd231ps_avx512vl(auVar97,auVar92,ZEXT1632(auVar89));
          auVar185 = ZEXT3264(auVar101);
          auVar97 = vmaxps_avx(auVar99,auVar101);
          uVar21 = vcmpps_avx512vl(auVar97,auVar92,2);
          bVar82 = bVar82 & (byte)uVar21;
          if (bVar82 != 0) {
            auVar65._4_4_ = auVar96._4_4_ * auVar95._4_4_;
            auVar65._0_4_ = auVar96._0_4_ * auVar95._0_4_;
            auVar65._8_4_ = auVar96._8_4_ * auVar95._8_4_;
            auVar65._12_4_ = auVar96._12_4_ * auVar95._12_4_;
            auVar65._16_4_ = auVar96._16_4_ * auVar95._16_4_;
            auVar65._20_4_ = auVar96._20_4_ * auVar95._20_4_;
            auVar65._24_4_ = auVar96._24_4_ * auVar95._24_4_;
            auVar65._28_4_ = auVar97._28_4_;
            auVar8 = vfmsub231ps_fma(auVar65,auVar107,auVar111);
            auVar66._4_4_ = auVar111._4_4_ * auVar109._4_4_;
            auVar66._0_4_ = auVar111._0_4_ * auVar109._0_4_;
            auVar66._8_4_ = auVar111._8_4_ * auVar109._8_4_;
            auVar66._12_4_ = auVar111._12_4_ * auVar109._12_4_;
            auVar66._16_4_ = auVar111._16_4_ * auVar109._16_4_;
            auVar66._20_4_ = auVar111._20_4_ * auVar109._20_4_;
            auVar66._24_4_ = auVar111._24_4_ * auVar109._24_4_;
            auVar66._28_4_ = auVar111._28_4_;
            auVar87 = vfmsub231ps_fma(auVar66,auVar98,auVar96);
            auVar67._4_4_ = auVar107._4_4_ * auVar98._4_4_;
            auVar67._0_4_ = auVar107._0_4_ * auVar98._0_4_;
            auVar67._8_4_ = auVar107._8_4_ * auVar98._8_4_;
            auVar67._12_4_ = auVar107._12_4_ * auVar98._12_4_;
            auVar67._16_4_ = auVar107._16_4_ * auVar98._16_4_;
            auVar67._20_4_ = auVar107._20_4_ * auVar98._20_4_;
            auVar67._24_4_ = auVar107._24_4_ * auVar98._24_4_;
            auVar67._28_4_ = auVar107._28_4_;
            auVar85 = vfmsub231ps_fma(auVar67,auVar109,auVar95);
            auVar89 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar87),ZEXT1632(auVar85));
            auVar88 = vfmadd231ps_fma(ZEXT1632(auVar89),ZEXT1632(auVar8),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar97 = vrcp14ps_avx512vl(ZEXT1632(auVar88));
            auVar194 = ZEXT3264(auVar97);
            auVar31._8_4_ = 0x3f800000;
            auVar31._0_8_ = 0x3f8000003f800000;
            auVar31._12_4_ = 0x3f800000;
            auVar31._16_4_ = 0x3f800000;
            auVar31._20_4_ = 0x3f800000;
            auVar31._24_4_ = 0x3f800000;
            auVar31._28_4_ = 0x3f800000;
            auVar95 = vfnmadd213ps_avx512vl(auVar97,ZEXT1632(auVar88),auVar31);
            auVar89 = vfmadd132ps_fma(auVar95,auVar97,auVar97);
            auVar190 = ZEXT1664(auVar89);
            auVar68._4_4_ = auVar85._4_4_ * auVar128._4_4_;
            auVar68._0_4_ = auVar85._0_4_ * auVar128._0_4_;
            auVar68._8_4_ = auVar85._8_4_ * auVar128._8_4_;
            auVar68._12_4_ = auVar85._12_4_ * auVar128._12_4_;
            auVar68._16_4_ = fVar159 * 0.0;
            auVar68._20_4_ = fVar170 * 0.0;
            auVar68._24_4_ = fVar148 * 0.0;
            auVar68._28_4_ = iVar1;
            auVar87 = vfmadd231ps_fma(auVar68,auVar110,ZEXT1632(auVar87));
            auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar108,ZEXT1632(auVar8));
            fVar148 = auVar89._0_4_;
            fVar159 = auVar89._4_4_;
            fVar83 = auVar89._8_4_;
            fVar84 = auVar89._12_4_;
            local_280 = ZEXT1632(CONCAT412(auVar87._12_4_ * fVar84,
                                           CONCAT48(auVar87._8_4_ * fVar83,
                                                    CONCAT44(auVar87._4_4_ * fVar159,
                                                             auVar87._0_4_ * fVar148))));
            auVar199 = ZEXT3264(local_280);
            uVar21 = vcmpps_avx512vl(local_280,local_3e0,0xd);
            fVar170 = (ray->super_RayK<1>).tfar;
            auVar32._4_4_ = fVar170;
            auVar32._0_4_ = fVar170;
            auVar32._8_4_ = fVar170;
            auVar32._12_4_ = fVar170;
            auVar32._16_4_ = fVar170;
            auVar32._20_4_ = fVar170;
            auVar32._24_4_ = fVar170;
            auVar32._28_4_ = fVar170;
            uVar23 = vcmpps_avx512vl(local_280,auVar32,2);
            bVar82 = (byte)uVar21 & (byte)uVar23 & bVar82;
            if (bVar82 != 0) {
              uVar81 = vcmpps_avx512vl(ZEXT1632(auVar88),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar81 = bVar82 & uVar81;
              if ((char)uVar81 != '\0') {
                fVar170 = auVar99._0_4_ * fVar148;
                fVar137 = auVar99._4_4_ * fVar159;
                auVar69._4_4_ = fVar137;
                auVar69._0_4_ = fVar170;
                fVar138 = auVar99._8_4_ * fVar83;
                auVar69._8_4_ = fVar138;
                fVar141 = auVar99._12_4_ * fVar84;
                auVar69._12_4_ = fVar141;
                fVar169 = auVar99._16_4_ * 0.0;
                auVar69._16_4_ = fVar169;
                fVar144 = auVar99._20_4_ * 0.0;
                auVar69._20_4_ = fVar144;
                fVar145 = auVar99._24_4_ * 0.0;
                auVar69._24_4_ = fVar145;
                auVar69._28_4_ = auVar99._28_4_;
                auVar168._8_4_ = 0x3f800000;
                auVar168._0_8_ = 0x3f8000003f800000;
                auVar168._12_4_ = 0x3f800000;
                auVar168._16_4_ = 0x3f800000;
                auVar168._20_4_ = 0x3f800000;
                auVar168._24_4_ = 0x3f800000;
                auVar168._28_4_ = 0x3f800000;
                auVar97 = vsubps_avx(auVar168,auVar69);
                local_2c0._0_4_ =
                     (float)((uint)(bVar73 & 1) * (int)fVar170 |
                            (uint)!(bool)(bVar73 & 1) * auVar97._0_4_);
                bVar15 = (bool)((byte)(uVar74 >> 1) & 1);
                local_2c0._4_4_ =
                     (float)((uint)bVar15 * (int)fVar137 | (uint)!bVar15 * auVar97._4_4_);
                bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
                local_2c0._8_4_ =
                     (float)((uint)bVar15 * (int)fVar138 | (uint)!bVar15 * auVar97._8_4_);
                bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
                local_2c0._12_4_ =
                     (float)((uint)bVar15 * (int)fVar141 | (uint)!bVar15 * auVar97._12_4_);
                bVar15 = (bool)((byte)(uVar74 >> 4) & 1);
                local_2c0._16_4_ =
                     (float)((uint)bVar15 * (int)fVar169 | (uint)!bVar15 * auVar97._16_4_);
                bVar15 = (bool)((byte)(uVar74 >> 5) & 1);
                local_2c0._20_4_ =
                     (float)((uint)bVar15 * (int)fVar144 | (uint)!bVar15 * auVar97._20_4_);
                bVar15 = (bool)((byte)(uVar74 >> 6) & 1);
                local_2c0._24_4_ =
                     (float)((uint)bVar15 * (int)fVar145 | (uint)!bVar15 * auVar97._24_4_);
                bVar15 = SUB81(uVar74 >> 7,0);
                local_2c0._28_4_ =
                     (float)((uint)bVar15 * auVar99._28_4_ | (uint)!bVar15 * auVar97._28_4_);
                auVar97 = vsubps_avx(auVar100,auVar94);
                auVar89 = vfmadd213ps_fma(auVar97,local_2c0,auVar94);
                fVar170 = pre->depth_scale;
                auVar33._4_4_ = fVar170;
                auVar33._0_4_ = fVar170;
                auVar33._8_4_ = fVar170;
                auVar33._12_4_ = fVar170;
                auVar33._16_4_ = fVar170;
                auVar33._20_4_ = fVar170;
                auVar33._24_4_ = fVar170;
                auVar33._28_4_ = fVar170;
                auVar97 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar89._12_4_ + auVar89._12_4_,
                                                             CONCAT48(auVar89._8_4_ + auVar89._8_4_,
                                                                      CONCAT44(auVar89._4_4_ +
                                                                               auVar89._4_4_,
                                                                               auVar89._0_4_ +
                                                                               auVar89._0_4_)))),
                                          auVar33);
                uVar22 = vcmpps_avx512vl(local_280,auVar97,6);
                uVar81 = uVar81 & uVar22;
                bVar82 = (byte)uVar81;
                if (bVar82 != 0) {
                  auVar161._0_4_ = auVar101._0_4_ * fVar148;
                  auVar161._4_4_ = auVar101._4_4_ * fVar159;
                  auVar161._8_4_ = auVar101._8_4_ * fVar83;
                  auVar161._12_4_ = auVar101._12_4_ * fVar84;
                  auVar161._16_4_ = auVar101._16_4_ * 0.0;
                  auVar161._20_4_ = auVar101._20_4_ * 0.0;
                  auVar161._24_4_ = auVar101._24_4_ * 0.0;
                  auVar161._28_4_ = 0;
                  auVar184._8_4_ = 0x3f800000;
                  auVar184._0_8_ = 0x3f8000003f800000;
                  auVar184._12_4_ = 0x3f800000;
                  auVar184._16_4_ = 0x3f800000;
                  auVar184._20_4_ = 0x3f800000;
                  auVar184._24_4_ = 0x3f800000;
                  auVar184._28_4_ = 0x3f800000;
                  auVar185 = ZEXT3264(auVar184);
                  auVar97 = vsubps_avx(auVar184,auVar161);
                  auVar133._0_4_ =
                       (uint)(bVar73 & 1) * (int)auVar161._0_4_ |
                       (uint)!(bool)(bVar73 & 1) * auVar97._0_4_;
                  bVar15 = (bool)((byte)(uVar74 >> 1) & 1);
                  auVar133._4_4_ =
                       (uint)bVar15 * (int)auVar161._4_4_ | (uint)!bVar15 * auVar97._4_4_;
                  bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
                  auVar133._8_4_ =
                       (uint)bVar15 * (int)auVar161._8_4_ | (uint)!bVar15 * auVar97._8_4_;
                  bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
                  auVar133._12_4_ =
                       (uint)bVar15 * (int)auVar161._12_4_ | (uint)!bVar15 * auVar97._12_4_;
                  bVar15 = (bool)((byte)(uVar74 >> 4) & 1);
                  auVar133._16_4_ =
                       (uint)bVar15 * (int)auVar161._16_4_ | (uint)!bVar15 * auVar97._16_4_;
                  bVar15 = (bool)((byte)(uVar74 >> 5) & 1);
                  auVar133._20_4_ =
                       (uint)bVar15 * (int)auVar161._20_4_ | (uint)!bVar15 * auVar97._20_4_;
                  bVar15 = (bool)((byte)(uVar74 >> 6) & 1);
                  auVar133._24_4_ =
                       (uint)bVar15 * (int)auVar161._24_4_ | (uint)!bVar15 * auVar97._24_4_;
                  auVar133._28_4_ = (uint)!SUB81(uVar74 >> 7,0) * auVar97._28_4_;
                  auVar34._8_4_ = 0x40000000;
                  auVar34._0_8_ = 0x4000000040000000;
                  auVar34._12_4_ = 0x40000000;
                  auVar34._16_4_ = 0x40000000;
                  auVar34._20_4_ = 0x40000000;
                  auVar34._24_4_ = 0x40000000;
                  auVar34._28_4_ = 0x40000000;
                  local_2a0 = vfmsub132ps_avx512vl(auVar133,auVar184,auVar34);
                  local_260 = (int)lVar77;
                  local_25c = iVar13;
                  auVar201 = ZEXT1664(local_4c0);
                  local_250 = local_4c0;
                  auVar202 = ZEXT1664(local_4d0);
                  local_240 = local_4d0;
                  local_230 = local_520;
                  uStack_228 = uStack_518;
                  local_220 = CONCAT44(fStack_52c,local_530);
                  uStack_218 = CONCAT44(fStack_524,fStack_528);
                  pGVar78 = (context->scene->geometries).items[local_550].ptr;
                  if ((pGVar78->mask & (ray->super_RayK<1>).mask) != 0) {
                    uVar79 = (uint)uVar81;
                    auVar89 = vcvtsi2ss_avx512f(auVar91,(int)lVar77);
                    fVar170 = auVar89._0_4_;
                    local_200[0] = (fVar170 + local_2c0._0_4_ + 0.0) * local_120;
                    local_200[1] = (fVar170 + local_2c0._4_4_ + 1.0) * fStack_11c;
                    local_200[2] = (fVar170 + local_2c0._8_4_ + 2.0) * fStack_118;
                    local_200[3] = (fVar170 + local_2c0._12_4_ + 3.0) * fStack_114;
                    fStack_1f0 = (fVar170 + local_2c0._16_4_ + 4.0) * fStack_110;
                    fStack_1ec = (fVar170 + local_2c0._20_4_ + 5.0) * fStack_10c;
                    fStack_1e8 = (fVar170 + local_2c0._24_4_ + 6.0) * fStack_108;
                    fStack_1e4 = fVar170 + local_2c0._28_4_ + 7.0;
                    local_1e0 = local_2a0;
                    local_1c0 = local_280;
                    auVar156._8_4_ = 0x7f800000;
                    auVar156._0_8_ = 0x7f8000007f800000;
                    auVar156._12_4_ = 0x7f800000;
                    auVar156._16_4_ = 0x7f800000;
                    auVar156._20_4_ = 0x7f800000;
                    auVar156._24_4_ = 0x7f800000;
                    auVar156._28_4_ = 0x7f800000;
                    auVar97 = vblendmps_avx512vl(auVar156,local_280);
                    auVar134._0_4_ =
                         (uint)(bVar82 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar82 & 1) * 0x7f800000
                    ;
                    bVar15 = (bool)((byte)(uVar81 >> 1) & 1);
                    auVar134._4_4_ = (uint)bVar15 * auVar97._4_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar81 >> 2) & 1);
                    auVar134._8_4_ = (uint)bVar15 * auVar97._8_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar81 >> 3) & 1);
                    auVar134._12_4_ = (uint)bVar15 * auVar97._12_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar81 >> 4) & 1);
                    auVar134._16_4_ = (uint)bVar15 * auVar97._16_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar81 >> 5) & 1);
                    auVar134._20_4_ = (uint)bVar15 * auVar97._20_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar81 >> 6) & 1);
                    auVar134._24_4_ = (uint)bVar15 * auVar97._24_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = SUB81(uVar81 >> 7,0);
                    auVar134._28_4_ = (uint)bVar15 * auVar97._28_4_ | (uint)!bVar15 * 0x7f800000;
                    auVar97 = vshufps_avx(auVar134,auVar134,0xb1);
                    auVar97 = vminps_avx(auVar134,auVar97);
                    auVar95 = vshufpd_avx(auVar97,auVar97,5);
                    auVar97 = vminps_avx(auVar97,auVar95);
                    auVar95 = vpermpd_avx2(auVar97,0x4e);
                    auVar97 = vminps_avx(auVar97,auVar95);
                    uVar21 = vcmpps_avx512vl(auVar134,auVar97,0);
                    if (((byte)uVar21 & bVar82) != 0) {
                      uVar79 = (uint)((byte)uVar21 & bVar82);
                    }
                    uVar76 = 0;
                    for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
                      uVar76 = uVar76 + 1;
                    }
                    uVar74 = (ulong)uVar76;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar78->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_420 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                      local_140 = vmovdqa64_avx512vl(auVar208._0_32_);
                      local_440 = local_280;
                      local_460._0_8_ = pGVar78;
                      do {
                        local_4a4 = local_200[uVar74];
                        local_4a0 = *(undefined4 *)(local_1e0 + uVar74 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar74 * 4);
                        local_500.context = context->user;
                        fVar170 = 1.0 - local_4a4;
                        auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(local_4a4 * (fVar170 + fVar170))),
                                                  ZEXT416((uint)fVar170),ZEXT416((uint)fVar170));
                        auVar88 = ZEXT416((uint)local_4a4);
                        auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar88,
                                                  ZEXT416(0xc0a00000));
                        auVar87 = vfmadd231ss_fma(ZEXT416((uint)(local_4a4 * local_4a4 * 3.0)),
                                                  ZEXT416((uint)(local_4a4 + local_4a4)),auVar89);
                        auVar194 = ZEXT1664(auVar87);
                        auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar88,
                                                  ZEXT416(0x40000000));
                        auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar170 * fVar170 * -3.0)),
                                                  ZEXT416((uint)(fVar170 + fVar170)),auVar89);
                        auVar88 = vfmadd231ss_fma(ZEXT416((uint)(local_4a4 * local_4a4)),auVar88,
                                                  ZEXT416((uint)(fVar170 * -2.0)));
                        fVar170 = auVar8._0_4_ * 0.5;
                        fVar148 = auVar87._0_4_ * 0.5;
                        auVar185 = ZEXT464((uint)fVar148);
                        fVar159 = auVar89._0_4_ * 0.5;
                        fVar83 = auVar88._0_4_ * 0.5;
                        auVar175._0_4_ = fVar83 * local_530;
                        auVar175._4_4_ = fVar83 * fStack_52c;
                        auVar175._8_4_ = fVar83 * fStack_528;
                        auVar175._12_4_ = fVar83 * fStack_524;
                        auVar188._4_4_ = fVar159;
                        auVar188._0_4_ = fVar159;
                        auVar188._8_4_ = fVar159;
                        auVar188._12_4_ = fVar159;
                        auVar71._8_8_ = uStack_518;
                        auVar71._0_8_ = local_520;
                        auVar89 = vfmadd132ps_fma(auVar188,auVar175,auVar71);
                        auVar190 = ZEXT1664(auVar89);
                        auVar176._4_4_ = fVar148;
                        auVar176._0_4_ = fVar148;
                        auVar176._8_4_ = fVar148;
                        auVar176._12_4_ = fVar148;
                        auVar88 = vfmadd213ps_fma(auVar176,auVar202._0_16_,auVar89);
                        auVar165._4_4_ = fVar170;
                        auVar165._0_4_ = fVar170;
                        auVar165._8_4_ = fVar170;
                        auVar165._12_4_ = fVar170;
                        auVar88 = vfmadd213ps_fma(auVar165,auVar201._0_16_,auVar88);
                        local_4b0 = vmovlps_avx(auVar88);
                        local_4a8 = vextractps_avx(auVar88,2);
                        local_49c = (int)local_538;
                        local_498 = (int)local_550;
                        local_494 = (local_500.context)->instID[0];
                        local_490 = (local_500.context)->instPrimID[0];
                        local_554 = -1;
                        local_500.valid = &local_554;
                        local_500.geometryUserPtr = pGVar78->userPtr;
                        local_500.ray = (RTCRayN *)ray;
                        local_500.hit = (RTCHitN *)&local_4b0;
                        local_500.N = 1;
                        if (pGVar78->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01d2136f:
                          p_Var14 = context->args->filter;
                          if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar78->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar185 = ZEXT1664(auVar185._0_16_);
                            auVar190 = ZEXT1664(auVar190._0_16_);
                            auVar194 = ZEXT1664(auVar194._0_16_);
                            (*p_Var14)(&local_500);
                            auVar199 = ZEXT3264(local_440);
                            auVar202 = ZEXT1664(local_4d0);
                            auVar201 = ZEXT1664(local_4c0);
                            context = local_540;
                            pGVar78 = (Geometry *)local_460._0_8_;
                            ray = local_548;
                            if (*local_500.valid == 0) goto LAB_01d21427;
                          }
                          (((Vec3f *)((long)local_500.ray + 0x30))->field_0).components[0] =
                               *(float *)local_500.hit;
                          (((Vec3f *)((long)local_500.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_500.hit + 4);
                          (((Vec3f *)((long)local_500.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_500.hit + 8);
                          *(float *)((long)local_500.ray + 0x3c) = *(float *)(local_500.hit + 0xc);
                          *(float *)((long)local_500.ray + 0x40) = *(float *)(local_500.hit + 0x10);
                          *(float *)((long)local_500.ray + 0x44) = *(float *)(local_500.hit + 0x14);
                          *(float *)((long)local_500.ray + 0x48) = *(float *)(local_500.hit + 0x18);
                          *(float *)((long)local_500.ray + 0x4c) = *(float *)(local_500.hit + 0x1c);
                          *(float *)((long)local_500.ray + 0x50) = *(float *)(local_500.hit + 0x20);
                        }
                        else {
                          auVar185 = ZEXT464((uint)fVar148);
                          auVar190 = ZEXT1664(auVar89);
                          auVar194 = ZEXT1664(auVar87);
                          (*pGVar78->intersectionFilterN)(&local_500);
                          auVar199 = ZEXT3264(local_440);
                          auVar202 = ZEXT1664(local_4d0);
                          auVar201 = ZEXT1664(local_4c0);
                          context = local_540;
                          pGVar78 = (Geometry *)local_460._0_8_;
                          ray = local_548;
                          if (*local_500.valid != 0) goto LAB_01d2136f;
LAB_01d21427:
                          (local_548->super_RayK<1>).tfar = (float)local_420._0_4_;
                          context = local_540;
                          pGVar78 = (Geometry *)local_460._0_8_;
                          ray = local_548;
                        }
                        bVar82 = ~(byte)(1 << ((uint)uVar74 & 0x1f)) & (byte)uVar81;
                        fVar170 = (ray->super_RayK<1>).tfar;
                        auVar35._4_4_ = fVar170;
                        auVar35._0_4_ = fVar170;
                        auVar35._8_4_ = fVar170;
                        auVar35._12_4_ = fVar170;
                        auVar35._16_4_ = fVar170;
                        auVar35._20_4_ = fVar170;
                        auVar35._24_4_ = fVar170;
                        auVar35._28_4_ = fVar170;
                        uVar21 = vcmpps_avx512vl(auVar199._0_32_,auVar35,2);
                        if ((bVar82 & (byte)uVar21) == 0) goto LAB_01d214c7;
                        local_420 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                        bVar82 = bVar82 & (byte)uVar21;
                        uVar79 = (uint)bVar82;
                        uVar81 = (ulong)uVar79;
                        auVar157._8_4_ = 0x7f800000;
                        auVar157._0_8_ = 0x7f8000007f800000;
                        auVar157._12_4_ = 0x7f800000;
                        auVar157._16_4_ = 0x7f800000;
                        auVar157._20_4_ = 0x7f800000;
                        auVar157._24_4_ = 0x7f800000;
                        auVar157._28_4_ = 0x7f800000;
                        auVar97 = vblendmps_avx512vl(auVar157,auVar199._0_32_);
                        auVar135._0_4_ =
                             (uint)(bVar82 & 1) * auVar97._0_4_ |
                             (uint)!(bool)(bVar82 & 1) * 0x7f800000;
                        bVar15 = (bool)(bVar82 >> 1 & 1);
                        auVar135._4_4_ = (uint)bVar15 * auVar97._4_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar82 >> 2 & 1);
                        auVar135._8_4_ = (uint)bVar15 * auVar97._8_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar82 >> 3 & 1);
                        auVar135._12_4_ = (uint)bVar15 * auVar97._12_4_ | (uint)!bVar15 * 0x7f800000
                        ;
                        bVar15 = (bool)(bVar82 >> 4 & 1);
                        auVar135._16_4_ = (uint)bVar15 * auVar97._16_4_ | (uint)!bVar15 * 0x7f800000
                        ;
                        bVar15 = (bool)(bVar82 >> 5 & 1);
                        auVar135._20_4_ = (uint)bVar15 * auVar97._20_4_ | (uint)!bVar15 * 0x7f800000
                        ;
                        bVar15 = (bool)(bVar82 >> 6 & 1);
                        auVar135._24_4_ = (uint)bVar15 * auVar97._24_4_ | (uint)!bVar15 * 0x7f800000
                        ;
                        auVar135._28_4_ =
                             (uint)(bVar82 >> 7) * auVar97._28_4_ |
                             (uint)!(bool)(bVar82 >> 7) * 0x7f800000;
                        auVar97 = vshufps_avx(auVar135,auVar135,0xb1);
                        auVar97 = vminps_avx(auVar135,auVar97);
                        auVar95 = vshufpd_avx(auVar97,auVar97,5);
                        auVar97 = vminps_avx(auVar97,auVar95);
                        auVar95 = vpermpd_avx2(auVar97,0x4e);
                        auVar97 = vminps_avx(auVar97,auVar95);
                        uVar21 = vcmpps_avx512vl(auVar135,auVar97,0);
                        bVar82 = (byte)uVar21 & bVar82;
                        if (bVar82 != 0) {
                          uVar79 = (uint)bVar82;
                        }
                        uVar76 = 0;
                        for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
                          uVar76 = uVar76 + 1;
                        }
                        uVar74 = (ulong)uVar76;
                      } while( true );
                    }
                    fVar170 = local_200[uVar74];
                    fVar148 = *(float *)(local_1e0 + uVar74 * 4);
                    fVar159 = 1.0 - fVar170;
                    auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar170 * (fVar159 + fVar159))),
                                              ZEXT416((uint)fVar159),ZEXT416((uint)fVar159));
                    auVar87 = ZEXT416((uint)fVar170);
                    auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar87,
                                              ZEXT416(0xc0a00000));
                    auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar170 * fVar170 * 3.0)),
                                              ZEXT416((uint)(fVar170 + fVar170)),auVar89);
                    auVar194 = ZEXT1664(auVar88);
                    auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar87,
                                              ZEXT416(0x40000000));
                    auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar159 * fVar159 * -3.0)),
                                              ZEXT416((uint)(fVar159 + fVar159)),auVar89);
                    auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar170 * fVar170)),auVar87,
                                              ZEXT416((uint)(fVar159 * -2.0)));
                    fVar159 = auVar8._0_4_ * 0.5;
                    fVar83 = auVar88._0_4_ * 0.5;
                    fVar84 = auVar89._0_4_ * 0.5;
                    fVar137 = auVar87._0_4_ * 0.5;
                    auVar173._0_4_ = fVar137 * local_530;
                    auVar173._4_4_ = fVar137 * fStack_52c;
                    auVar173._8_4_ = fVar137 * fStack_528;
                    auVar173._12_4_ = fVar137 * fStack_524;
                    auVar187._4_4_ = fVar84;
                    auVar187._0_4_ = fVar84;
                    auVar187._8_4_ = fVar84;
                    auVar187._12_4_ = fVar84;
                    auVar70._8_8_ = uStack_518;
                    auVar70._0_8_ = local_520;
                    auVar89 = vfmadd132ps_fma(auVar187,auVar173,auVar70);
                    auVar190 = ZEXT1664(auVar89);
                    auVar174._4_4_ = fVar83;
                    auVar174._0_4_ = fVar83;
                    auVar174._8_4_ = fVar83;
                    auVar174._12_4_ = fVar83;
                    auVar89 = vfmadd213ps_fma(auVar174,local_4d0,auVar89);
                    auVar164._4_4_ = fVar159;
                    auVar164._0_4_ = fVar159;
                    auVar164._8_4_ = fVar159;
                    auVar164._12_4_ = fVar159;
                    auVar185 = ZEXT464((uint)*(float *)(local_1c0 + uVar74 * 4));
                    (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar74 * 4);
                    auVar89 = vfmadd213ps_fma(auVar164,local_4c0,auVar89);
                    uVar21 = vmovlps_avx(auVar89);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar21;
                    fVar159 = (float)vextractps_avx(auVar89,2);
                    (ray->Ng).field_0.field_0.z = fVar159;
                    ray->u = fVar170;
                    ray->v = fVar148;
                    ray->primID = (uint)local_538;
                    ray->geomID = (uint)local_550;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01d2117d;
      }
LAB_01d20839:
      fVar170 = (ray->super_RayK<1>).tfar;
      auVar30._4_4_ = fVar170;
      auVar30._0_4_ = fVar170;
      auVar30._8_4_ = fVar170;
      auVar30._12_4_ = fVar170;
      auVar30._16_4_ = fVar170;
      auVar30._20_4_ = fVar170;
      auVar30._24_4_ = fVar170;
      auVar30._28_4_ = fVar170;
      uVar21 = vcmpps_avx512vl(local_80,auVar30,2);
      uVar79 = (uint)uVar80 & (uint)uVar21;
      uVar80 = (ulong)uVar79;
    } while (uVar79 != 0);
  }
  return;
LAB_01d214c7:
  auVar212 = ZEXT3264(local_480);
  auVar97 = vmovdqa64_avx512vl(local_140);
  auVar208 = ZEXT3264(auVar97);
  pre = local_510;
  prim = local_508;
LAB_01d2117d:
  lVar77 = lVar77 + 8;
  if (iVar13 <= (int)lVar77) goto LAB_01d20839;
  goto LAB_01d208c2;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }